

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  uint uVar48;
  uint uVar49;
  long lVar50;
  byte bVar51;
  uint uVar52;
  undefined4 uVar53;
  undefined8 unaff_RBP;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar85;
  float fVar87;
  vint4 bi_2;
  undefined1 auVar61 [16];
  float fVar88;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar86;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar89;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined8 uVar90;
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 extraout_var [56];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  vint4 ai_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar134;
  float fVar144;
  vint4 ai;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  vint4 bi;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  float fVar158;
  float fVar178;
  float fVar179;
  vint4 ai_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar180;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  float fVar193;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar185 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar194;
  undefined1 auVar192 [32];
  float fVar198;
  float fVar209;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar210;
  float fVar226;
  vfloat4 a0_2;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar227;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  vfloat4 a0_3;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  vfloat4 a0_1;
  undefined1 auVar251 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar250 [16];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar259;
  float fVar270;
  float fVar271;
  vfloat4 a0;
  float fVar272;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar275 [16];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar286 [32];
  vfloat_impl<4> p00;
  undefined1 local_618 [8];
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 uStack_600;
  undefined1 local_568 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_528 [16];
  undefined1 (*local_510) [16];
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 auStack_4f8 [16];
  undefined1 local_4e8 [32];
  RTCFilterFunctionNArguments args;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined4 local_428;
  undefined4 local_418;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  uint mask_stack [4];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar111 [64];
  undefined1 auVar285 [32];
  
  PVar4 = prim[1];
  uVar54 = (ulong)(byte)PVar4;
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar106 = vsubps_avx(auVar106,*(undefined1 (*) [16])(prim + uVar54 * 0x19 + 6));
  fVar57 = *(float *)(prim + uVar54 * 0x19 + 0x12);
  auVar61._0_4_ = fVar57 * auVar106._0_4_;
  auVar61._4_4_ = fVar57 * auVar106._4_4_;
  auVar61._8_4_ = fVar57 * auVar106._8_4_;
  auVar61._12_4_ = fVar57 * auVar106._12_4_;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 4 + 6)));
  auVar159._0_4_ = fVar57 * auVar10._0_4_;
  auVar159._4_4_ = fVar57 * auVar10._4_4_;
  auVar159._8_4_ = fVar57 * auVar10._8_4_;
  auVar159._12_4_ = fVar57 * auVar10._12_4_;
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 5 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 6 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xb + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xc + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0xd + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x12 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x13 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 * 0x14 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar273._4_4_ = auVar159._0_4_;
  auVar273._0_4_ = auVar159._0_4_;
  auVar273._8_4_ = auVar159._0_4_;
  auVar273._12_4_ = auVar159._0_4_;
  auVar112 = vshufps_avx(auVar159,auVar159,0x55);
  auVar62 = vshufps_avx(auVar159,auVar159,0xaa);
  fVar57 = auVar62._0_4_;
  auVar228._0_4_ = fVar57 * auVar12._0_4_;
  fVar85 = auVar62._4_4_;
  auVar228._4_4_ = fVar85 * auVar12._4_4_;
  fVar60 = auVar62._8_4_;
  auVar228._8_4_ = fVar60 * auVar12._8_4_;
  fVar88 = auVar62._12_4_;
  auVar228._12_4_ = fVar88 * auVar12._12_4_;
  auVar211._0_4_ = auVar15._0_4_ * fVar57;
  auVar211._4_4_ = auVar15._4_4_ * fVar85;
  auVar211._8_4_ = auVar15._8_4_ * fVar60;
  auVar211._12_4_ = auVar15._12_4_ * fVar88;
  auVar199._0_4_ = auVar92._0_4_ * fVar57;
  auVar199._4_4_ = auVar92._4_4_ * fVar85;
  auVar199._8_4_ = auVar92._8_4_ * fVar60;
  auVar199._12_4_ = auVar92._12_4_ * fVar88;
  auVar62 = vfmadd231ps_fma(auVar228,auVar112,auVar10);
  auVar93 = vfmadd231ps_fma(auVar211,auVar112,auVar14);
  auVar112 = vfmadd231ps_fma(auVar199,auVar63,auVar112);
  auVar123 = vfmadd231ps_fma(auVar62,auVar273,auVar106);
  auVar93 = vfmadd231ps_fma(auVar93,auVar273,auVar13);
  auVar135 = vfmadd231ps_fma(auVar112,auVar64,auVar273);
  auVar274._4_4_ = auVar61._0_4_;
  auVar274._0_4_ = auVar61._0_4_;
  auVar274._8_4_ = auVar61._0_4_;
  auVar274._12_4_ = auVar61._0_4_;
  auVar112 = vshufps_avx(auVar61,auVar61,0x55);
  auVar62 = vshufps_avx(auVar61,auVar61,0xaa);
  fVar57 = auVar62._0_4_;
  auVar160._0_4_ = fVar57 * auVar12._0_4_;
  fVar85 = auVar62._4_4_;
  auVar160._4_4_ = fVar85 * auVar12._4_4_;
  fVar60 = auVar62._8_4_;
  auVar160._8_4_ = fVar60 * auVar12._8_4_;
  fVar88 = auVar62._12_4_;
  auVar160._12_4_ = fVar88 * auVar12._12_4_;
  auVar91._0_4_ = auVar15._0_4_ * fVar57;
  auVar91._4_4_ = auVar15._4_4_ * fVar85;
  auVar91._8_4_ = auVar15._8_4_ * fVar60;
  auVar91._12_4_ = auVar15._12_4_ * fVar88;
  auVar62._0_4_ = auVar92._0_4_ * fVar57;
  auVar62._4_4_ = auVar92._4_4_ * fVar85;
  auVar62._8_4_ = auVar92._8_4_ * fVar60;
  auVar62._12_4_ = auVar92._12_4_ * fVar88;
  auVar10 = vfmadd231ps_fma(auVar160,auVar112,auVar10);
  auVar12 = vfmadd231ps_fma(auVar91,auVar112,auVar14);
  auVar14 = vfmadd231ps_fma(auVar62,auVar112,auVar63);
  auVar63 = vfmadd231ps_fma(auVar10,auVar274,auVar106);
  auVar92 = vfmadd231ps_fma(auVar12,auVar274,auVar13);
  auVar242._8_4_ = 0x7fffffff;
  auVar242._0_8_ = 0x7fffffff7fffffff;
  auVar242._12_4_ = 0x7fffffff;
  auVar106 = vandps_avx(auVar123,auVar242);
  auVar181._8_4_ = 0x219392ef;
  auVar181._0_8_ = 0x219392ef219392ef;
  auVar181._12_4_ = 0x219392ef;
  auVar106 = vcmpps_avx(auVar106,auVar181,1);
  auVar10 = vblendvps_avx(auVar123,auVar181,auVar106);
  auVar106 = vandps_avx(auVar93,auVar242);
  auVar106 = vcmpps_avx(auVar106,auVar181,1);
  auVar12 = vblendvps_avx(auVar93,auVar181,auVar106);
  auVar106 = vandps_avx(auVar135,auVar242);
  auVar106 = vcmpps_avx(auVar106,auVar181,1);
  auVar106 = vblendvps_avx(auVar135,auVar181,auVar106);
  auVar112 = vfmadd231ps_fma(auVar14,auVar274,auVar64);
  auVar13 = vrcpps_avx(auVar10);
  auVar182._8_4_ = 0x3f800000;
  auVar182._0_8_ = 0x3f8000003f800000;
  auVar182._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar13,auVar182);
  auVar13 = vfmadd132ps_fma(auVar10,auVar13,auVar13);
  auVar10 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar10,auVar182);
  auVar15 = vfmadd132ps_fma(auVar12,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar106);
  auVar106 = vfnmadd213ps_fma(auVar106,auVar10,auVar182);
  auVar64 = vfmadd132ps_fma(auVar106,auVar10,auVar10);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar54 * 7 + 6);
  auVar106 = vpmovsxwd_avx(auVar106);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar63);
  auVar135._0_4_ = auVar13._0_4_ * auVar106._0_4_;
  auVar135._4_4_ = auVar13._4_4_ * auVar106._4_4_;
  auVar135._8_4_ = auVar13._8_4_ * auVar106._8_4_;
  auVar135._12_4_ = auVar13._12_4_ * auVar106._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar54 * 9 + 6);
  auVar106 = vpmovsxwd_avx(auVar10);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar63);
  auVar145._0_4_ = auVar13._0_4_ * auVar106._0_4_;
  auVar145._4_4_ = auVar13._4_4_ * auVar106._4_4_;
  auVar145._8_4_ = auVar13._8_4_ * auVar106._8_4_;
  auVar145._12_4_ = auVar13._12_4_ * auVar106._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar54 * 0xe + 6);
  auVar106 = vpmovsxwd_avx(auVar12);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar92);
  auVar161._0_4_ = auVar15._0_4_ * auVar106._0_4_;
  auVar161._4_4_ = auVar15._4_4_ * auVar106._4_4_;
  auVar161._8_4_ = auVar15._8_4_ * auVar106._8_4_;
  auVar161._12_4_ = auVar15._12_4_ * auVar106._12_4_;
  auVar93._1_3_ = 0;
  auVar93[0] = PVar4;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar106 = vpmovsxwd_avx(auVar13);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar10 = vsubps_avx(auVar106,auVar92);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar54 * 0x15 + 6);
  auVar106 = vpmovsxwd_avx(auVar14);
  auVar92._0_4_ = auVar15._0_4_ * auVar10._0_4_;
  auVar92._4_4_ = auVar15._4_4_ * auVar10._4_4_;
  auVar92._8_4_ = auVar15._8_4_ * auVar10._8_4_;
  auVar92._12_4_ = auVar15._12_4_ * auVar10._12_4_;
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar112);
  auVar123._0_4_ = auVar64._0_4_ * auVar106._0_4_;
  auVar123._4_4_ = auVar64._4_4_ * auVar106._4_4_;
  auVar123._8_4_ = auVar64._8_4_ * auVar106._8_4_;
  auVar123._12_4_ = auVar64._12_4_ * auVar106._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar54 * 0x17 + 6);
  auVar106 = vpmovsxwd_avx(auVar15);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar112);
  auVar63._0_4_ = auVar64._0_4_ * auVar106._0_4_;
  auVar63._4_4_ = auVar64._4_4_ * auVar106._4_4_;
  auVar63._8_4_ = auVar64._8_4_ * auVar106._8_4_;
  auVar63._12_4_ = auVar64._12_4_ * auVar106._12_4_;
  auVar106 = vpminsd_avx(auVar135,auVar145);
  auVar10 = vpminsd_avx(auVar161,auVar92);
  auVar106 = vmaxps_avx(auVar106,auVar10);
  auVar10 = vpminsd_avx(auVar123,auVar63);
  uVar53 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar212._4_4_ = uVar53;
  auVar212._0_4_ = uVar53;
  auVar212._8_4_ = uVar53;
  auVar212._12_4_ = uVar53;
  auVar10 = vmaxps_avx(auVar10,auVar212);
  auVar106 = vmaxps_avx(auVar106,auVar10);
  auVar200._0_4_ = auVar106._0_4_ * 0.99999964;
  auVar200._4_4_ = auVar106._4_4_ * 0.99999964;
  auVar200._8_4_ = auVar106._8_4_ * 0.99999964;
  auVar200._12_4_ = auVar106._12_4_ * 0.99999964;
  auVar106 = vpmaxsd_avx(auVar135,auVar145);
  auVar10 = vpmaxsd_avx(auVar161,auVar92);
  auVar106 = vminps_avx(auVar106,auVar10);
  auVar10 = vpmaxsd_avx(auVar123,auVar63);
  uVar53 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar112._4_4_ = uVar53;
  auVar112._0_4_ = uVar53;
  auVar112._8_4_ = uVar53;
  auVar112._12_4_ = uVar53;
  auVar10 = vminps_avx(auVar10,auVar112);
  auVar106 = vminps_avx(auVar106,auVar10);
  auVar64._0_4_ = auVar106._0_4_ * 1.0000004;
  auVar64._4_4_ = auVar106._4_4_ * 1.0000004;
  auVar64._8_4_ = auVar106._8_4_ * 1.0000004;
  auVar64._12_4_ = auVar106._12_4_ * 1.0000004;
  auVar93[4] = PVar4;
  auVar93._5_3_ = 0;
  auVar93[8] = PVar4;
  auVar93._9_3_ = 0;
  auVar93[0xc] = PVar4;
  auVar93._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar93,_DAT_01f4ad30);
  auVar106 = vcmpps_avx(auVar200,auVar64,2);
  auVar106 = vandps_avx(auVar106,auVar10);
  uVar53 = vmovmskps_avx(auVar106);
  uVar54 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar53);
  auVar82._16_16_ = mm_lookupmask_ps._240_16_;
  auVar82._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,0x80);
  local_510 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_01131780:
  if (uVar54 == 0) {
    return;
  }
  lVar50 = 0;
  for (uVar56 = uVar54; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  uVar49 = *(uint *)(prim + 2);
  uVar5 = *(uint *)(prim + lVar50 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar49].ptr;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar5);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar15 = *(undefined1 (*) [16])(_Var9 + uVar56 * (long)pvVar8);
  auVar106 = *(undefined1 (*) [16])(_Var9 + (uVar56 + 1) * (long)pvVar8);
  auVar10 = *(undefined1 (*) [16])(_Var9 + (uVar56 + 2) * (long)pvVar8);
  pfVar1 = (float *)(_Var9 + (long)pvVar8 * (uVar56 + 3));
  fVar57 = *pfVar1;
  fVar85 = pfVar1[1];
  fVar60 = pfVar1[2];
  fVar88 = pfVar1[3];
  lVar50 = *(long *)&pGVar6[1].time_range.upper;
  auVar12 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * uVar56);
  auVar13 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * (uVar56 + 1));
  auVar14 = *(undefined1 (*) [16])(lVar50 + (long)p_Var7 * (uVar56 + 2));
  uVar54 = uVar54 - 1 & uVar54;
  pfVar1 = (float *)(lVar50 + (long)p_Var7 * (uVar56 + 3));
  fVar158 = *pfVar1;
  fVar178 = pfVar1[1];
  fVar179 = pfVar1[2];
  fVar180 = pfVar1[3];
  if (uVar54 != 0) {
    uVar55 = uVar54 - 1 & uVar54;
    for (uVar56 = uVar54; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    }
    if (uVar55 != 0) {
      for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar251._0_4_ = fVar158 * 0.0;
  auVar251._4_4_ = fVar178 * 0.0;
  auVar251._8_4_ = fVar179 * 0.0;
  auVar251._12_4_ = fVar180 * 0.0;
  auVar275._8_4_ = 0x3e2aaaab;
  auVar275._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar275._12_4_ = 0x3e2aaaab;
  auVar63 = vfmadd213ps_fma(auVar275,auVar14,auVar251);
  auVar201._8_4_ = 0x3f2aaaab;
  auVar201._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar201._12_4_ = 0x3f2aaaab;
  auVar63 = vfmadd231ps_fma(auVar63,auVar13,auVar201);
  auVar92 = vfmadd231ps_fma(auVar63,auVar12,auVar275);
  auVar65._8_4_ = 0x3f000000;
  auVar65._0_8_ = 0x3f0000003f000000;
  auVar65._12_4_ = 0x3f000000;
  auVar63 = vfmadd231ps_fma(auVar251,auVar14,auVar65);
  auVar63 = vfnmadd231ps_fma(auVar63,auVar13,ZEXT816(0) << 0x40);
  auVar62 = vfnmadd231ps_fma(auVar63,auVar12,auVar65);
  auVar248._0_4_ = fVar57 * 0.0;
  auVar248._4_4_ = fVar85 * 0.0;
  auVar248._8_4_ = fVar60 * 0.0;
  auVar248._12_4_ = fVar88 * 0.0;
  auVar135 = ZEXT816(0) << 0x40;
  auVar63 = vfmadd213ps_fma(auVar275,auVar10,auVar248);
  auVar63 = vfmadd231ps_fma(auVar63,auVar106,auVar201);
  auVar63 = vfmadd231ps_fma(auVar63,auVar15,auVar275);
  auVar112 = vfmadd231ps_fma(auVar248,auVar10,auVar65);
  auVar112 = vfnmadd231ps_fma(auVar112,auVar106,auVar135);
  auVar93 = vfnmadd231ps_fma(auVar112,auVar15,auVar65);
  auVar126._0_4_ = fVar158 * 0.16666667;
  auVar126._4_4_ = fVar178 * 0.16666667;
  auVar126._8_4_ = fVar179 * 0.16666667;
  auVar126._12_4_ = fVar180 * 0.16666667;
  auVar112 = vfmadd231ps_fma(auVar126,auVar14,auVar201);
  auVar112 = vfmadd231ps_fma(auVar112,auVar13,auVar275);
  auVar112 = vfmadd231ps_fma(auVar112,auVar12,auVar135);
  auVar136._0_4_ = fVar158 * 0.5;
  auVar136._4_4_ = fVar178 * 0.5;
  auVar136._8_4_ = fVar179 * 0.5;
  auVar136._12_4_ = fVar180 * 0.5;
  auVar14 = vfmadd231ps_fma(auVar136,auVar135,auVar14);
  auVar13 = vfnmadd231ps_fma(auVar14,auVar65,auVar13);
  auVar123 = vfnmadd231ps_fma(auVar13,auVar135,auVar12);
  auVar213._0_4_ = fVar57 * 0.16666667;
  auVar213._4_4_ = fVar85 * 0.16666667;
  auVar213._8_4_ = fVar60 * 0.16666667;
  auVar213._12_4_ = fVar88 * 0.16666667;
  auVar113._8_4_ = 0x3f2aaaab;
  auVar113._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar113._12_4_ = 0x3f2aaaab;
  auVar12 = vfmadd231ps_fma(auVar213,auVar10,auVar113);
  auVar12 = vfmadd231ps_fma(auVar12,auVar106,auVar275);
  auVar14 = vfmadd231ps_fma(auVar12,auVar15,auVar135);
  auVar229._0_4_ = fVar57 * 0.5;
  auVar229._4_4_ = fVar85 * 0.5;
  auVar229._8_4_ = fVar60 * 0.5;
  auVar229._12_4_ = fVar88 * 0.5;
  auVar10 = vfmadd231ps_fma(auVar229,auVar135,auVar10);
  auVar106 = vfnmadd231ps_fma(auVar10,auVar65,auVar106);
  auVar135 = vfnmadd231ps_fma(auVar106,auVar135,auVar15);
  auVar106 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar10 = vshufps_avx(auVar63,auVar63,0xc9);
  fVar122 = auVar62._0_4_;
  auVar162._0_4_ = fVar122 * auVar10._0_4_;
  fVar86 = auVar62._4_4_;
  auVar162._4_4_ = fVar86 * auVar10._4_4_;
  fVar87 = auVar62._8_4_;
  auVar162._8_4_ = fVar87 * auVar10._8_4_;
  fVar59 = auVar62._12_4_;
  auVar162._12_4_ = fVar59 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar162,auVar106,auVar63);
  auVar12 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar93,auVar93,0xc9);
  auVar163._0_4_ = fVar122 * auVar10._0_4_;
  auVar163._4_4_ = fVar86 * auVar10._4_4_;
  auVar163._8_4_ = fVar87 * auVar10._8_4_;
  auVar163._12_4_ = fVar59 * auVar10._12_4_;
  auVar106 = vfmsub231ps_fma(auVar163,auVar106,auVar93);
  auVar13 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar10 = vshufps_avx(auVar123,auVar123,0xc9);
  auVar106 = vshufps_avx(auVar14,auVar14,0xc9);
  fVar58 = auVar123._0_4_;
  auVar146._0_4_ = fVar58 * auVar106._0_4_;
  fVar227 = auVar123._4_4_;
  auVar146._4_4_ = fVar227 * auVar106._4_4_;
  fVar134 = auVar123._8_4_;
  auVar146._8_4_ = fVar134 * auVar106._8_4_;
  fVar144 = auVar123._12_4_;
  auVar146._12_4_ = fVar144 * auVar106._12_4_;
  auVar106 = vfmsub231ps_fma(auVar146,auVar10,auVar14);
  auVar14 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar15 = vshufps_avx(auVar135,auVar135,0xc9);
  auVar106 = vdpps_avx(auVar12,auVar12,0x7f);
  auVar183._0_4_ = fVar58 * auVar15._0_4_;
  auVar183._4_4_ = fVar227 * auVar15._4_4_;
  auVar183._8_4_ = fVar134 * auVar15._8_4_;
  auVar183._12_4_ = fVar144 * auVar15._12_4_;
  auVar10 = vfmsub231ps_fma(auVar183,auVar10,auVar135);
  auVar15 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar85 = auVar106._0_4_;
  auVar63 = ZEXT416((uint)fVar85);
  auVar10 = vrsqrtss_avx(auVar63,auVar63);
  fVar57 = auVar10._0_4_;
  fVar57 = fVar57 * 1.5 + fVar85 * -0.5 * fVar57 * fVar57 * fVar57;
  auVar10 = vdpps_avx(auVar12,auVar13,0x7f);
  fVar158 = auVar12._0_4_ * fVar57;
  fVar178 = auVar12._4_4_ * fVar57;
  fVar179 = auVar12._8_4_ * fVar57;
  fVar180 = auVar12._12_4_ * fVar57;
  auVar243._0_4_ = auVar13._0_4_ * fVar85;
  auVar243._4_4_ = auVar13._4_4_ * fVar85;
  auVar243._8_4_ = auVar13._8_4_ * fVar85;
  auVar243._12_4_ = auVar13._12_4_ * fVar85;
  fVar85 = auVar10._0_4_;
  auVar202._0_4_ = auVar12._0_4_ * fVar85;
  auVar202._4_4_ = auVar12._4_4_ * fVar85;
  auVar202._8_4_ = auVar12._8_4_ * fVar85;
  auVar202._12_4_ = auVar12._12_4_ * fVar85;
  auVar12 = vsubps_avx(auVar243,auVar202);
  auVar10 = vrcpss_avx(auVar63,auVar63);
  auVar106 = vfnmadd213ss_fma(auVar106,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar60 = auVar10._0_4_ * auVar106._0_4_;
  auVar106 = vdpps_avx(auVar14,auVar14,0x7f);
  fVar88 = auVar106._0_4_;
  auVar63 = ZEXT416((uint)fVar88);
  auVar10 = vrsqrtss_avx(auVar63,auVar63);
  fVar85 = auVar10._0_4_;
  fVar85 = fVar85 * 1.5 + fVar88 * -0.5 * fVar85 * fVar85 * fVar85;
  auVar10 = vdpps_avx(auVar14,auVar15,0x7f);
  fVar259 = fVar85 * auVar14._0_4_;
  fVar270 = fVar85 * auVar14._4_4_;
  fVar271 = fVar85 * auVar14._8_4_;
  fVar272 = fVar85 * auVar14._12_4_;
  auVar184._0_4_ = fVar88 * auVar15._0_4_;
  auVar184._4_4_ = fVar88 * auVar15._4_4_;
  auVar184._8_4_ = fVar88 * auVar15._8_4_;
  auVar184._12_4_ = fVar88 * auVar15._12_4_;
  fVar88 = auVar10._0_4_;
  auVar147._0_4_ = fVar88 * auVar14._0_4_;
  auVar147._4_4_ = fVar88 * auVar14._4_4_;
  auVar147._8_4_ = fVar88 * auVar14._8_4_;
  auVar147._12_4_ = fVar88 * auVar14._12_4_;
  auVar13 = vsubps_avx(auVar184,auVar147);
  auVar10 = vrcpss_avx(auVar63,auVar63);
  auVar106 = vfnmadd213ss_fma(auVar106,auVar10,ZEXT416(0x40000000));
  fVar88 = auVar106._0_4_ * auVar10._0_4_;
  auVar106 = vshufps_avx(auVar92,auVar92,0xff);
  auVar214._0_4_ = auVar106._0_4_ * fVar158;
  auVar214._4_4_ = auVar106._4_4_ * fVar178;
  auVar214._8_4_ = auVar106._8_4_ * fVar179;
  auVar214._12_4_ = auVar106._12_4_ * fVar180;
  auVar63 = vsubps_avx(auVar92,auVar214);
  auVar10 = vshufps_avx(auVar62,auVar62,0xff);
  auVar164._0_4_ = auVar10._0_4_ * fVar158 + fVar57 * auVar12._0_4_ * fVar60 * auVar106._0_4_;
  auVar164._4_4_ = auVar10._4_4_ * fVar178 + fVar57 * auVar12._4_4_ * fVar60 * auVar106._4_4_;
  auVar164._8_4_ = auVar10._8_4_ * fVar179 + fVar57 * auVar12._8_4_ * fVar60 * auVar106._8_4_;
  auVar164._12_4_ = auVar10._12_4_ * fVar180 + fVar57 * auVar12._12_4_ * fVar60 * auVar106._12_4_;
  auVar12 = vsubps_avx(auVar62,auVar164);
  auVar230._0_4_ = auVar92._0_4_ + auVar214._0_4_;
  auVar230._4_4_ = auVar92._4_4_ + auVar214._4_4_;
  auVar230._8_4_ = auVar92._8_4_ + auVar214._8_4_;
  auVar230._12_4_ = auVar92._12_4_ + auVar214._12_4_;
  auVar106 = vshufps_avx(auVar112,auVar112,0xff);
  auVar114._0_4_ = fVar259 * auVar106._0_4_;
  auVar114._4_4_ = fVar270 * auVar106._4_4_;
  auVar114._8_4_ = fVar271 * auVar106._8_4_;
  auVar114._12_4_ = fVar272 * auVar106._12_4_;
  auVar92 = vsubps_avx(auVar112,auVar114);
  auVar10 = vshufps_avx(auVar123,auVar123,0xff);
  auVar94._0_4_ = fVar259 * auVar10._0_4_ + auVar106._0_4_ * fVar85 * auVar13._0_4_ * fVar88;
  auVar94._4_4_ = fVar270 * auVar10._4_4_ + auVar106._4_4_ * fVar85 * auVar13._4_4_ * fVar88;
  auVar94._8_4_ = fVar271 * auVar10._8_4_ + auVar106._8_4_ * fVar85 * auVar13._8_4_ * fVar88;
  auVar94._12_4_ = fVar272 * auVar10._12_4_ + auVar106._12_4_ * fVar85 * auVar13._12_4_ * fVar88;
  auVar106 = vsubps_avx(auVar123,auVar94);
  fVar158 = auVar112._0_4_ + auVar114._0_4_;
  fVar178 = auVar112._4_4_ + auVar114._4_4_;
  fVar179 = auVar112._8_4_ + auVar114._8_4_;
  fVar180 = auVar112._12_4_ + auVar114._12_4_;
  auVar124._0_4_ = auVar63._0_4_ + auVar12._0_4_ * 0.33333334;
  auVar124._4_4_ = auVar63._4_4_ + auVar12._4_4_ * 0.33333334;
  auVar124._8_4_ = auVar63._8_4_ + auVar12._8_4_ * 0.33333334;
  auVar124._12_4_ = auVar63._12_4_ + auVar12._12_4_ * 0.33333334;
  auVar95._0_4_ = auVar106._0_4_ * 0.33333334;
  auVar95._4_4_ = auVar106._4_4_ * 0.33333334;
  auVar95._8_4_ = auVar106._8_4_ * 0.33333334;
  auVar95._12_4_ = auVar106._12_4_ * 0.33333334;
  auVar112 = vsubps_avx(auVar92,auVar95);
  auVar62 = vsubps_avx(auVar63,auVar64);
  auVar106 = vshufps_avx(auVar62,auVar62,0x55);
  auVar10 = vshufps_avx(auVar62,auVar62,0xaa);
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar57 = pre->ray_space[k].vz.field_0.m128[0];
  fVar85 = pre->ray_space[k].vz.field_0.m128[1];
  fVar60 = pre->ray_space[k].vz.field_0.m128[2];
  fVar88 = pre->ray_space[k].vz.field_0.m128[3];
  auVar244._0_4_ = fVar57 * auVar10._0_4_;
  auVar244._4_4_ = fVar85 * auVar10._4_4_;
  auVar244._8_4_ = fVar60 * auVar10._8_4_;
  auVar244._12_4_ = fVar88 * auVar10._12_4_;
  auVar12 = vfmadd231ps_fma(auVar244,(undefined1  [16])aVar3,auVar106);
  auVar93 = vsubps_avx(auVar124,auVar64);
  auVar106 = vshufps_avx(auVar93,auVar93,0x55);
  auVar10 = vshufps_avx(auVar93,auVar93,0xaa);
  auVar281._0_4_ = fVar57 * auVar10._0_4_;
  auVar281._4_4_ = fVar85 * auVar10._4_4_;
  auVar281._8_4_ = fVar60 * auVar10._8_4_;
  auVar281._12_4_ = fVar88 * auVar10._12_4_;
  auVar10 = vfmadd231ps_fma(auVar281,(undefined1  [16])aVar3,auVar106);
  auVar123 = vsubps_avx(auVar112,auVar64);
  auVar106 = vshufps_avx(auVar123,auVar123,0xaa);
  auVar249._0_4_ = fVar57 * auVar106._0_4_;
  auVar249._4_4_ = fVar85 * auVar106._4_4_;
  auVar249._8_4_ = fVar60 * auVar106._8_4_;
  auVar249._12_4_ = fVar88 * auVar106._12_4_;
  auVar106 = vshufps_avx(auVar123,auVar123,0x55);
  auVar13 = vfmadd231ps_fma(auVar249,(undefined1  [16])aVar3,auVar106);
  auVar135 = vsubps_avx(auVar92,auVar64);
  auVar106 = vshufps_avx(auVar135,auVar135,0xaa);
  auVar260._0_4_ = fVar57 * auVar106._0_4_;
  auVar260._4_4_ = fVar85 * auVar106._4_4_;
  auVar260._8_4_ = fVar60 * auVar106._8_4_;
  auVar260._12_4_ = fVar88 * auVar106._12_4_;
  auVar106 = vshufps_avx(auVar135,auVar135,0x55);
  auVar14 = vfmadd231ps_fma(auVar260,(undefined1  [16])aVar3,auVar106);
  auVar61 = vsubps_avx(auVar230,auVar64);
  auVar106 = vshufps_avx(auVar61,auVar61,0xaa);
  auVar148._0_4_ = fVar57 * auVar106._0_4_;
  auVar148._4_4_ = fVar85 * auVar106._4_4_;
  auVar148._8_4_ = fVar60 * auVar106._8_4_;
  auVar148._12_4_ = fVar88 * auVar106._12_4_;
  auVar106 = vshufps_avx(auVar61,auVar61,0x55);
  auVar15 = vfmadd231ps_fma(auVar148,(undefined1  [16])aVar3,auVar106);
  auVar66._0_4_ = (fVar122 + auVar164._0_4_) * 0.33333334 + auVar230._0_4_;
  auVar66._4_4_ = (fVar86 + auVar164._4_4_) * 0.33333334 + auVar230._4_4_;
  auVar66._8_4_ = (fVar87 + auVar164._8_4_) * 0.33333334 + auVar230._8_4_;
  auVar66._12_4_ = (fVar59 + auVar164._12_4_) * 0.33333334 + auVar230._12_4_;
  auVar91 = vsubps_avx(auVar66,auVar64);
  auVar106 = vshufps_avx(auVar91,auVar91,0xaa);
  auVar203._0_4_ = auVar106._0_4_ * fVar57;
  auVar203._4_4_ = auVar106._4_4_ * fVar85;
  auVar203._8_4_ = auVar106._8_4_ * fVar60;
  auVar203._12_4_ = auVar106._12_4_ * fVar88;
  auVar106 = vshufps_avx(auVar91,auVar91,0x55);
  auVar161 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar3,auVar106);
  auVar215._0_4_ = (fVar58 + auVar94._0_4_) * 0.33333334;
  auVar215._4_4_ = (fVar227 + auVar94._4_4_) * 0.33333334;
  auVar215._8_4_ = (fVar134 + auVar94._8_4_) * 0.33333334;
  auVar215._12_4_ = (fVar144 + auVar94._12_4_) * 0.33333334;
  auVar23._4_4_ = fVar178;
  auVar23._0_4_ = fVar158;
  auVar23._8_4_ = fVar179;
  auVar23._12_4_ = fVar180;
  auVar145 = vsubps_avx(auVar23,auVar215);
  auVar159 = vsubps_avx(auVar145,auVar64);
  auVar106 = vshufps_avx(auVar159,auVar159,0xaa);
  auVar216._0_4_ = auVar106._0_4_ * fVar57;
  auVar216._4_4_ = auVar106._4_4_ * fVar85;
  auVar216._8_4_ = auVar106._8_4_ * fVar60;
  auVar216._12_4_ = auVar106._12_4_ * fVar88;
  auVar106 = vshufps_avx(auVar159,auVar159,0x55);
  auVar181 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar3,auVar106);
  auVar160 = vsubps_avx(auVar23,auVar64);
  auVar106 = vshufps_avx(auVar160,auVar160,0xaa);
  auVar67._0_4_ = fVar57 * auVar106._0_4_;
  auVar67._4_4_ = fVar85 * auVar106._4_4_;
  auVar67._8_4_ = fVar60 * auVar106._8_4_;
  auVar67._12_4_ = fVar88 * auVar106._12_4_;
  auVar106 = vshufps_avx(auVar160,auVar160,0x55);
  auVar106 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar3,auVar106);
  local_418 = auVar62._0_4_;
  auVar165._4_4_ = local_418;
  auVar165._0_4_ = local_418;
  auVar165._8_4_ = local_418;
  auVar165._12_4_ = local_418;
  aVar3 = pre->ray_space[k].vx.field_0;
  auVar182 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar3,auVar165);
  local_428 = auVar93._0_4_;
  auVar166._4_4_ = local_428;
  auVar166._0_4_ = local_428;
  auVar166._8_4_ = local_428;
  auVar166._12_4_ = local_428;
  auVar199 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar3,auVar166);
  uVar53 = auVar123._0_4_;
  auVar167._4_4_ = uVar53;
  auVar167._0_4_ = uVar53;
  auVar167._8_4_ = uVar53;
  auVar167._12_4_ = uVar53;
  auVar211 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar167);
  uVar53 = auVar135._0_4_;
  auVar168._4_4_ = uVar53;
  auVar168._0_4_ = uVar53;
  auVar168._8_4_ = uVar53;
  auVar168._12_4_ = uVar53;
  auVar212 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar3,auVar168);
  uVar53 = auVar61._0_4_;
  auVar169._4_4_ = uVar53;
  auVar169._0_4_ = uVar53;
  auVar169._8_4_ = uVar53;
  auVar169._12_4_ = uVar53;
  auVar228 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar3,auVar169);
  uVar53 = auVar91._0_4_;
  auVar170._4_4_ = uVar53;
  auVar170._0_4_ = uVar53;
  auVar170._8_4_ = uVar53;
  auVar170._12_4_ = uVar53;
  auVar273 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar3,auVar170);
  uVar53 = auVar159._0_4_;
  auVar171._4_4_ = uVar53;
  auVar171._0_4_ = uVar53;
  auVar171._8_4_ = uVar53;
  auVar171._12_4_ = uVar53;
  auVar274 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar171);
  uVar53 = auVar160._0_4_;
  auVar172._4_4_ = uVar53;
  auVar172._0_4_ = uVar53;
  auVar172._8_4_ = uVar53;
  auVar172._12_4_ = uVar53;
  auVar23 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar3,auVar172);
  auVar13 = vmovlhps_avx(auVar182,auVar228);
  auVar14 = vmovlhps_avx(auVar199,auVar273);
  auVar15 = vmovlhps_avx(auVar211,auVar274);
  auVar64 = vmovlhps_avx(auVar212,auVar23);
  auVar106 = vminps_avx(auVar13,auVar14);
  auVar10 = vminps_avx(auVar15,auVar64);
  auVar12 = vminps_avx(auVar106,auVar10);
  auVar106 = vmaxps_avx(auVar13,auVar14);
  auVar10 = vmaxps_avx(auVar15,auVar64);
  auVar106 = vmaxps_avx(auVar106,auVar10);
  auVar10 = vshufpd_avx(auVar12,auVar12,3);
  auVar12 = vminps_avx(auVar12,auVar10);
  auVar10 = vshufpd_avx(auVar106,auVar106,3);
  auVar10 = vmaxps_avx(auVar106,auVar10);
  auVar106 = vandps_avx(auVar242,auVar12);
  auVar10 = vandps_avx(auVar242,auVar10);
  auVar106 = vmaxps_avx(auVar106,auVar10);
  auVar10 = vmovshdup_avx(auVar106);
  auVar106 = vmaxss_avx(auVar10,auVar106);
  fVar85 = auVar106._0_4_ * 9.536743e-07;
  auVar185._8_8_ = auVar182._0_8_;
  auVar185._0_8_ = auVar182._0_8_;
  auVar231._8_8_ = auVar199._0_8_;
  auVar231._0_8_ = auVar199._0_8_;
  auVar250._0_8_ = auVar211._0_8_;
  auVar250._8_8_ = auVar250._0_8_;
  auVar261._0_8_ = auVar212._0_8_;
  auVar261._8_8_ = auVar261._0_8_;
  local_78 = fVar85;
  fStack_74 = fVar85;
  fStack_70 = fVar85;
  fStack_6c = fVar85;
  fStack_68 = fVar85;
  fStack_64 = fVar85;
  fStack_60 = fVar85;
  fStack_5c = fVar85;
  fStack_90 = -fVar85;
  local_98 = -fVar85;
  fStack_94 = -fVar85;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  uVar56 = 0;
  fVar57 = *(float *)(ray + k * 4 + 0x30);
  auVar10 = vsubps_avx(auVar14,auVar13);
  auVar12 = vsubps_avx(auVar15,auVar14);
  auVar161 = vsubps_avx(auVar64,auVar15);
  auVar181 = vsubps_avx(auVar230,auVar63);
  auVar182 = vsubps_avx(auVar66,auVar124);
  auVar199 = vsubps_avx(auVar145,auVar112);
  auVar129._4_4_ = fVar178;
  auVar129._0_4_ = fVar158;
  auVar129._8_4_ = fVar179;
  auVar129._12_4_ = fVar180;
  auVar211 = vsubps_avx(auVar129,auVar92);
  auVar68 = ZEXT816(0x3f80000000000000);
  auVar106 = auVar68;
LAB_01131f77:
  auVar212 = vshufps_avx(auVar68,auVar68,0x50);
  auVar282._8_4_ = 0x3f800000;
  auVar282._0_8_ = 0x3f8000003f800000;
  auVar282._12_4_ = 0x3f800000;
  auVar285._16_4_ = 0x3f800000;
  auVar285._0_16_ = auVar282;
  auVar285._20_4_ = 0x3f800000;
  auVar285._24_4_ = 0x3f800000;
  auVar285._28_4_ = 0x3f800000;
  auVar129 = vsubps_avx(auVar282,auVar212);
  fVar60 = auVar212._0_4_;
  fVar134 = auVar228._0_4_;
  auVar69._0_4_ = fVar134 * fVar60;
  fVar88 = auVar212._4_4_;
  fVar144 = auVar228._4_4_;
  auVar69._4_4_ = fVar144 * fVar88;
  fVar122 = auVar212._8_4_;
  auVar69._8_4_ = fVar134 * fVar122;
  fVar86 = auVar212._12_4_;
  auVar69._12_4_ = fVar144 * fVar86;
  fVar259 = auVar273._0_4_;
  auVar173._0_4_ = fVar259 * fVar60;
  fVar270 = auVar273._4_4_;
  auVar173._4_4_ = fVar270 * fVar88;
  auVar173._8_4_ = fVar259 * fVar122;
  auVar173._12_4_ = fVar270 * fVar86;
  fVar198 = auVar274._0_4_;
  auVar137._0_4_ = fVar198 * fVar60;
  fVar209 = auVar274._4_4_;
  auVar137._4_4_ = fVar209 * fVar88;
  auVar137._8_4_ = fVar198 * fVar122;
  auVar137._12_4_ = fVar209 * fVar86;
  fVar210 = auVar23._0_4_;
  auVar115._0_4_ = fVar210 * fVar60;
  fVar226 = auVar23._4_4_;
  auVar115._4_4_ = fVar226 * fVar88;
  auVar115._8_4_ = fVar210 * fVar122;
  auVar115._12_4_ = fVar226 * fVar86;
  auVar251 = vfmadd231ps_fma(auVar69,auVar129,auVar185);
  auVar94 = vfmadd231ps_fma(auVar173,auVar129,auVar231);
  auVar95 = vfmadd231ps_fma(auVar137,auVar129,auVar250);
  auVar244 = vfmadd231ps_fma(auVar115,auVar261,auVar129);
  auVar212 = vmovshdup_avx(auVar106);
  fVar60 = auVar106._0_4_;
  fStack_140 = (auVar212._0_4_ - fVar60) * 0.04761905;
  auVar224._4_4_ = fVar60;
  auVar224._0_4_ = fVar60;
  auVar224._8_4_ = fVar60;
  auVar224._12_4_ = fVar60;
  auVar224._16_4_ = fVar60;
  auVar224._20_4_ = fVar60;
  auVar224._24_4_ = fVar60;
  auVar224._28_4_ = fVar60;
  auVar107._0_8_ = auVar212._0_8_;
  auVar107._8_8_ = auVar107._0_8_;
  auVar107._16_8_ = auVar107._0_8_;
  auVar107._24_8_ = auVar107._0_8_;
  auVar82 = vsubps_avx(auVar107,auVar224);
  uVar53 = auVar251._0_4_;
  auVar279._4_4_ = uVar53;
  auVar279._0_4_ = uVar53;
  auVar279._8_4_ = uVar53;
  auVar279._12_4_ = uVar53;
  auVar279._16_4_ = uVar53;
  auVar279._20_4_ = uVar53;
  auVar279._24_4_ = uVar53;
  auVar279._28_4_ = uVar53;
  auVar212 = vmovshdup_avx(auVar251);
  uVar90 = auVar212._0_8_;
  auVar269._8_8_ = uVar90;
  auVar269._0_8_ = uVar90;
  auVar269._16_8_ = uVar90;
  auVar269._24_8_ = uVar90;
  fVar271 = auVar94._0_4_;
  auVar256._4_4_ = fVar271;
  auVar256._0_4_ = fVar271;
  auVar256._8_4_ = fVar271;
  auVar256._12_4_ = fVar271;
  auVar256._16_4_ = fVar271;
  auVar256._20_4_ = fVar271;
  auVar256._24_4_ = fVar271;
  auVar256._28_4_ = fVar271;
  auVar129 = vmovshdup_avx(auVar94);
  auVar108._0_8_ = auVar129._0_8_;
  auVar108._8_8_ = auVar108._0_8_;
  auVar108._16_8_ = auVar108._0_8_;
  auVar108._24_8_ = auVar108._0_8_;
  fVar227 = auVar95._0_4_;
  auVar190._4_4_ = fVar227;
  auVar190._0_4_ = fVar227;
  auVar190._8_4_ = fVar227;
  auVar190._12_4_ = fVar227;
  auVar190._16_4_ = fVar227;
  auVar190._20_4_ = fVar227;
  auVar190._24_4_ = fVar227;
  auVar190._28_4_ = fVar227;
  auVar65 = vmovshdup_avx(auVar95);
  auVar207._0_8_ = auVar65._0_8_;
  auVar207._8_8_ = auVar207._0_8_;
  auVar207._16_8_ = auVar207._0_8_;
  auVar207._24_8_ = auVar207._0_8_;
  fVar58 = auVar244._0_4_;
  auVar67 = vmovshdup_avx(auVar244);
  auVar113 = vfmadd132ps_fma(auVar82,auVar224,_DAT_01f7b040);
  auVar82 = vsubps_avx(auVar285,ZEXT1632(auVar113));
  fVar60 = auVar113._0_4_;
  fVar88 = auVar113._4_4_;
  auVar16._4_4_ = fVar271 * fVar88;
  auVar16._0_4_ = fVar271 * fVar60;
  fVar122 = auVar113._8_4_;
  auVar16._8_4_ = fVar271 * fVar122;
  fVar86 = auVar113._12_4_;
  auVar16._12_4_ = fVar271 * fVar86;
  auVar16._16_4_ = fVar271 * 0.0;
  auVar16._20_4_ = fVar271 * 0.0;
  auVar16._24_4_ = fVar271 * 0.0;
  auVar16._28_4_ = 0x3f800000;
  auVar113 = vfmadd231ps_fma(auVar16,auVar82,auVar279);
  fVar87 = auVar129._0_4_;
  fVar59 = auVar129._4_4_;
  auVar17._4_4_ = fVar59 * fVar88;
  auVar17._0_4_ = fVar87 * fVar60;
  auVar17._8_4_ = fVar87 * fVar122;
  auVar17._12_4_ = fVar59 * fVar86;
  auVar17._16_4_ = fVar87 * 0.0;
  auVar17._20_4_ = fVar59 * 0.0;
  auVar17._24_4_ = fVar87 * 0.0;
  auVar17._28_4_ = uVar53;
  auVar114 = vfmadd231ps_fma(auVar17,auVar82,auVar269);
  auVar18._4_4_ = fVar227 * fVar88;
  auVar18._0_4_ = fVar227 * fVar60;
  auVar18._8_4_ = fVar227 * fVar122;
  auVar18._12_4_ = fVar227 * fVar86;
  auVar18._16_4_ = fVar227 * 0.0;
  auVar18._20_4_ = fVar227 * 0.0;
  auVar18._24_4_ = fVar227 * 0.0;
  auVar18._28_4_ = auVar212._4_4_;
  auVar126 = vfmadd231ps_fma(auVar18,auVar82,auVar256);
  fVar87 = auVar65._0_4_;
  fVar59 = auVar65._4_4_;
  auVar11._4_4_ = fVar59 * fVar88;
  auVar11._0_4_ = fVar87 * fVar60;
  auVar11._8_4_ = fVar87 * fVar122;
  auVar11._12_4_ = fVar59 * fVar86;
  auVar11._16_4_ = fVar87 * 0.0;
  auVar11._20_4_ = fVar59 * 0.0;
  auVar11._24_4_ = fVar87 * 0.0;
  auVar11._28_4_ = fVar271;
  auVar136 = vfmadd231ps_fma(auVar11,auVar82,auVar108);
  auVar212 = vshufps_avx(auVar251,auVar251,0xaa);
  local_568._8_8_ = auVar212._0_8_;
  local_568._0_8_ = local_568._8_8_;
  local_568._16_8_ = local_568._8_8_;
  local_568._24_8_ = local_568._8_8_;
  auVar129 = vshufps_avx(auVar251,auVar251,0xff);
  uStack_610 = auVar129._0_8_;
  local_618 = (undefined1  [8])uStack_610;
  uStack_608 = uStack_610;
  uStack_600 = uStack_610;
  auVar19._4_4_ = fVar58 * fVar88;
  auVar19._0_4_ = fVar58 * fVar60;
  auVar19._8_4_ = fVar58 * fVar122;
  auVar19._12_4_ = fVar58 * fVar86;
  auVar19._16_4_ = fVar58 * 0.0;
  auVar19._20_4_ = fVar58 * 0.0;
  auVar19._24_4_ = fVar58 * 0.0;
  auVar19._28_4_ = fVar58;
  auVar251 = vfmadd231ps_fma(auVar19,auVar82,auVar190);
  auVar129 = vshufps_avx(auVar94,auVar94,0xaa);
  auVar191._0_8_ = auVar129._0_8_;
  auVar191._8_8_ = auVar191._0_8_;
  auVar191._16_8_ = auVar191._0_8_;
  auVar191._24_8_ = auVar191._0_8_;
  auVar65 = vshufps_avx(auVar94,auVar94,0xff);
  local_4e8._8_8_ = auVar65._0_8_;
  local_4e8._0_8_ = local_4e8._8_8_;
  local_4e8._16_8_ = local_4e8._8_8_;
  local_4e8._24_8_ = local_4e8._8_8_;
  fVar87 = auVar67._0_4_;
  fVar59 = auVar67._4_4_;
  auVar20._4_4_ = fVar59 * fVar88;
  auVar20._0_4_ = fVar87 * fVar60;
  auVar20._8_4_ = fVar87 * fVar122;
  auVar20._12_4_ = fVar59 * fVar86;
  auVar20._16_4_ = fVar87 * 0.0;
  auVar20._20_4_ = fVar59 * 0.0;
  auVar20._24_4_ = fVar87 * 0.0;
  auVar20._28_4_ = auVar212._4_4_;
  auVar146 = vfmadd231ps_fma(auVar20,auVar82,auVar207);
  auVar21._28_4_ = fVar59;
  auVar21._0_28_ =
       ZEXT1628(CONCAT412(auVar126._12_4_ * fVar86,
                          CONCAT48(auVar126._8_4_ * fVar122,
                                   CONCAT44(auVar126._4_4_ * fVar88,auVar126._0_4_ * fVar60))));
  auVar113 = vfmadd231ps_fma(auVar21,auVar82,ZEXT1632(auVar113));
  fVar87 = auVar65._4_4_;
  auVar258._28_4_ = fVar87;
  auVar258._0_28_ =
       ZEXT1628(CONCAT412(auVar136._12_4_ * fVar86,
                          CONCAT48(auVar136._8_4_ * fVar122,
                                   CONCAT44(auVar136._4_4_ * fVar88,auVar136._0_4_ * fVar60))));
  auVar114 = vfmadd231ps_fma(auVar258,auVar82,ZEXT1632(auVar114));
  auVar212 = vshufps_avx(auVar95,auVar95,0xaa);
  uVar90 = auVar212._0_8_;
  auVar177._8_8_ = uVar90;
  auVar177._0_8_ = uVar90;
  auVar177._16_8_ = uVar90;
  auVar177._24_8_ = uVar90;
  auVar67 = vshufps_avx(auVar95,auVar95,0xff);
  uVar90 = auVar67._0_8_;
  auVar286._8_8_ = uVar90;
  auVar286._0_8_ = uVar90;
  auVar286._16_8_ = uVar90;
  auVar286._24_8_ = uVar90;
  auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar251._12_4_ * fVar86,
                                               CONCAT48(auVar251._8_4_ * fVar122,
                                                        CONCAT44(auVar251._4_4_ * fVar88,
                                                                 auVar251._0_4_ * fVar60)))),auVar82
                            ,ZEXT1632(auVar126));
  auVar251 = vshufps_avx(auVar244,auVar244,0xaa);
  auVar94 = vshufps_avx(auVar244,auVar244,0xff);
  auVar244 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar146._12_4_,
                                                CONCAT48(fVar122 * auVar146._8_4_,
                                                         CONCAT44(fVar88 * auVar146._4_4_,
                                                                  fVar60 * auVar146._0_4_)))),
                             auVar82,ZEXT1632(auVar136));
  auVar126 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar95._12_4_,
                                                CONCAT48(fVar122 * auVar95._8_4_,
                                                         CONCAT44(fVar88 * auVar95._4_4_,
                                                                  fVar60 * auVar95._0_4_)))),auVar82
                             ,ZEXT1632(auVar113));
  auVar16 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar113));
  auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar244._12_4_,
                                               CONCAT48(fVar122 * auVar244._8_4_,
                                                        CONCAT44(fVar88 * auVar244._4_4_,
                                                                 fVar60 * auVar244._0_4_)))),auVar82
                            ,ZEXT1632(auVar114));
  auVar17 = vsubps_avx(ZEXT1632(auVar244),ZEXT1632(auVar114));
  fStack_3cc = auVar17._28_4_;
  auVar257._0_4_ = fStack_140 * auVar16._0_4_ * 3.0;
  auVar257._4_4_ = fStack_140 * auVar16._4_4_ * 3.0;
  auVar257._8_4_ = fStack_140 * auVar16._8_4_ * 3.0;
  auVar257._12_4_ = fStack_140 * auVar16._12_4_ * 3.0;
  auVar257._16_4_ = fStack_140 * auVar16._16_4_ * 3.0;
  auVar257._20_4_ = fStack_140 * auVar16._20_4_ * 3.0;
  auVar257._24_4_ = fStack_140 * auVar16._24_4_ * 3.0;
  auVar257._28_4_ = 0;
  local_3e8._0_4_ = fStack_140 * auVar17._0_4_ * 3.0;
  local_3e8._4_4_ = fStack_140 * auVar17._4_4_ * 3.0;
  fStack_3e0 = fStack_140 * auVar17._8_4_ * 3.0;
  fStack_3dc = fStack_140 * auVar17._12_4_ * 3.0;
  fStack_3d8 = fStack_140 * auVar17._16_4_ * 3.0;
  fStack_3d4 = fStack_140 * auVar17._20_4_ * 3.0;
  fStack_3d0 = fStack_140 * auVar17._24_4_ * 3.0;
  fVar59 = auVar129._0_4_;
  fVar58 = auVar129._4_4_;
  auVar24._4_4_ = fVar58 * fVar88;
  auVar24._0_4_ = fVar59 * fVar60;
  auVar24._8_4_ = fVar59 * fVar122;
  auVar24._12_4_ = fVar58 * fVar86;
  auVar24._16_4_ = fVar59 * 0.0;
  auVar24._20_4_ = fVar58 * 0.0;
  auVar24._24_4_ = fVar59 * 0.0;
  auVar24._28_4_ = fStack_3cc;
  auVar129 = vfmadd231ps_fma(auVar24,auVar82,local_568);
  fVar59 = auVar65._0_4_;
  auVar25._4_4_ = fVar87 * fVar88;
  auVar25._0_4_ = fVar59 * fVar60;
  auVar25._8_4_ = fVar59 * fVar122;
  auVar25._12_4_ = fVar87 * fVar86;
  auVar25._16_4_ = fVar59 * 0.0;
  auVar25._20_4_ = fVar87 * 0.0;
  auVar25._24_4_ = fVar59 * 0.0;
  auVar25._28_4_ = 0;
  auVar65 = vfmadd231ps_fma(auVar25,auVar82,_local_618);
  fVar87 = auVar212._0_4_;
  fVar59 = auVar212._4_4_;
  auVar26._4_4_ = fVar59 * fVar88;
  auVar26._0_4_ = fVar87 * fVar60;
  auVar26._8_4_ = fVar87 * fVar122;
  auVar26._12_4_ = fVar59 * fVar86;
  auVar26._16_4_ = fVar87 * 0.0;
  auVar26._20_4_ = fVar59 * 0.0;
  auVar26._24_4_ = fVar87 * 0.0;
  auVar26._28_4_ = auVar16._28_4_;
  auVar212 = vfmadd231ps_fma(auVar26,auVar82,auVar191);
  fVar87 = auVar67._0_4_;
  fVar227 = auVar67._4_4_;
  auVar27._4_4_ = fVar227 * fVar88;
  auVar27._0_4_ = fVar87 * fVar60;
  auVar27._8_4_ = fVar87 * fVar122;
  auVar27._12_4_ = fVar227 * fVar86;
  auVar27._16_4_ = fVar87 * 0.0;
  auVar27._20_4_ = fVar227 * 0.0;
  auVar27._24_4_ = fVar87 * 0.0;
  auVar27._28_4_ = fVar58;
  auVar67 = vfmadd231ps_fma(auVar27,auVar82,local_4e8);
  local_4e8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar126));
  fVar87 = auVar251._0_4_;
  fVar59 = auVar251._4_4_;
  auVar28._4_4_ = fVar59 * fVar88;
  auVar28._0_4_ = fVar87 * fVar60;
  auVar28._8_4_ = fVar87 * fVar122;
  auVar28._12_4_ = fVar59 * fVar86;
  auVar28._16_4_ = fVar87 * 0.0;
  auVar28._20_4_ = fVar59 * 0.0;
  auVar28._24_4_ = fVar87 * 0.0;
  auVar28._28_4_ = fVar59;
  auVar251 = vfmadd231ps_fma(auVar28,auVar82,auVar177);
  auVar19 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar95));
  fVar87 = auVar94._0_4_;
  fVar59 = auVar94._4_4_;
  auVar29._4_4_ = fVar59 * fVar88;
  auVar29._0_4_ = fVar87 * fVar60;
  auVar29._8_4_ = fVar87 * fVar122;
  auVar29._12_4_ = fVar59 * fVar86;
  auVar29._16_4_ = fVar87 * 0.0;
  auVar29._20_4_ = fVar59 * 0.0;
  auVar29._24_4_ = fVar87 * 0.0;
  auVar29._28_4_ = fVar59;
  auVar94 = vfmadd231ps_fma(auVar29,auVar82,auVar286);
  auVar30._28_4_ = fVar227;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar212._12_4_ * fVar86,
                          CONCAT48(auVar212._8_4_ * fVar122,
                                   CONCAT44(auVar212._4_4_ * fVar88,auVar212._0_4_ * fVar60))));
  auVar129 = vfmadd231ps_fma(auVar30,auVar82,ZEXT1632(auVar129));
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar67._12_4_,
                                               CONCAT48(fVar122 * auVar67._8_4_,
                                                        CONCAT44(fVar88 * auVar67._4_4_,
                                                                 fVar60 * auVar67._0_4_)))),auVar82,
                            ZEXT1632(auVar65));
  auVar109._0_4_ = auVar126._0_4_ + auVar257._0_4_;
  auVar109._4_4_ = auVar126._4_4_ + auVar257._4_4_;
  auVar109._8_4_ = auVar126._8_4_ + auVar257._8_4_;
  auVar109._12_4_ = auVar126._12_4_ + auVar257._12_4_;
  auVar109._16_4_ = auVar257._16_4_ + 0.0;
  auVar109._20_4_ = auVar257._20_4_ + 0.0;
  auVar109._24_4_ = auVar257._24_4_ + 0.0;
  auVar109._28_4_ = 0;
  auVar212 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar251._12_4_ * fVar86,
                                                CONCAT48(auVar251._8_4_ * fVar122,
                                                         CONCAT44(auVar251._4_4_ * fVar88,
                                                                  auVar251._0_4_ * fVar60)))),
                             auVar82,ZEXT1632(auVar212));
  auVar67 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar86,
                                               CONCAT48(auVar94._8_4_ * fVar122,
                                                        CONCAT44(auVar94._4_4_ * fVar88,
                                                                 auVar94._0_4_ * fVar60)))),auVar82,
                            ZEXT1632(auVar67));
  auVar251 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar212._12_4_,
                                                CONCAT48(fVar122 * auVar212._8_4_,
                                                         CONCAT44(fVar88 * auVar212._4_4_,
                                                                  fVar60 * auVar212._0_4_)))),
                             auVar82,ZEXT1632(auVar129));
  auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar67._12_4_ * fVar86,
                                               CONCAT48(auVar67._8_4_ * fVar122,
                                                        CONCAT44(auVar67._4_4_ * fVar88,
                                                                 auVar67._0_4_ * fVar60)))),
                            ZEXT1632(auVar65),auVar82);
  auVar82 = vsubps_avx(ZEXT1632(auVar212),ZEXT1632(auVar129));
  auVar16 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar65));
  auVar280._0_4_ = fStack_140 * auVar82._0_4_ * 3.0;
  auVar280._4_4_ = fStack_140 * auVar82._4_4_ * 3.0;
  auVar280._8_4_ = fStack_140 * auVar82._8_4_ * 3.0;
  auVar280._12_4_ = fStack_140 * auVar82._12_4_ * 3.0;
  auVar280._16_4_ = fStack_140 * auVar82._16_4_ * 3.0;
  auVar280._20_4_ = fStack_140 * auVar82._20_4_ * 3.0;
  auVar280._24_4_ = fStack_140 * auVar82._24_4_ * 3.0;
  auVar280._28_4_ = 0;
  local_158 = fStack_140 * auVar16._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar16._4_4_ * 3.0;
  auVar31._4_4_ = fStack_154;
  auVar31._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar16._8_4_ * 3.0;
  auVar31._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar16._12_4_ * 3.0;
  auVar31._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar16._16_4_ * 3.0;
  auVar31._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar16._20_4_ * 3.0;
  auVar31._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar16._24_4_ * 3.0;
  auVar31._24_4_ = fStack_140;
  auVar31._28_4_ = 0x40400000;
  _local_508 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar251));
  auVar20 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar94));
  auVar82 = vsubps_avx(ZEXT1632(auVar251),ZEXT1632(auVar126));
  auVar16 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar95));
  auVar17 = vsubps_avx(_local_508,local_4e8);
  fVar271 = auVar82._0_4_ + auVar17._0_4_;
  fVar272 = auVar82._4_4_ + auVar17._4_4_;
  fVar193 = auVar82._8_4_ + auVar17._8_4_;
  fVar194 = auVar82._12_4_ + auVar17._12_4_;
  fVar195 = auVar82._16_4_ + auVar17._16_4_;
  fVar196 = auVar82._20_4_ + auVar17._20_4_;
  fVar197 = auVar82._24_4_ + auVar17._24_4_;
  auVar18 = vsubps_avx(auVar20,auVar19);
  auVar83._0_4_ = auVar16._0_4_ + auVar18._0_4_;
  auVar83._4_4_ = auVar16._4_4_ + auVar18._4_4_;
  auVar83._8_4_ = auVar16._8_4_ + auVar18._8_4_;
  auVar83._12_4_ = auVar16._12_4_ + auVar18._12_4_;
  auVar83._16_4_ = auVar16._16_4_ + auVar18._16_4_;
  auVar83._20_4_ = auVar16._20_4_ + auVar18._20_4_;
  auVar83._24_4_ = auVar16._24_4_ + auVar18._24_4_;
  auVar83._28_4_ = auVar16._28_4_ + auVar18._28_4_;
  local_f8 = ZEXT1632(auVar95);
  fVar60 = auVar95._0_4_;
  local_178 = (float)local_3e8._0_4_ + fVar60;
  fVar88 = auVar95._4_4_;
  fStack_174 = (float)local_3e8._4_4_ + fVar88;
  fVar122 = auVar95._8_4_;
  fStack_170 = fStack_3e0 + fVar122;
  fVar86 = auVar95._12_4_;
  fStack_16c = fStack_3dc + fVar86;
  fStack_168 = fStack_3d8 + 0.0;
  fStack_164 = fStack_3d4 + 0.0;
  fStack_160 = fStack_3d0 + 0.0;
  local_b8 = ZEXT1632(auVar126);
  auVar16 = vsubps_avx(local_b8,auVar257);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar16);
  auVar16 = vsubps_avx(local_f8,_local_3e8);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar16);
  local_118._0_4_ = auVar251._0_4_ + auVar280._0_4_;
  local_118._4_4_ = auVar251._4_4_ + auVar280._4_4_;
  local_118._8_4_ = auVar251._8_4_ + auVar280._8_4_;
  local_118._12_4_ = auVar251._12_4_ + auVar280._12_4_;
  local_118._16_4_ = auVar280._16_4_ + 0.0;
  local_118._20_4_ = auVar280._20_4_ + 0.0;
  local_118._24_4_ = auVar280._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar258 = ZEXT1632(auVar251);
  auVar16 = vsubps_avx(auVar258,auVar280);
  auVar21 = vpermps_avx2(_DAT_01fb7720,auVar16);
  fVar87 = auVar94._0_4_;
  local_158 = fVar87 + local_158;
  fVar59 = auVar94._4_4_;
  fStack_154 = fVar59 + fStack_154;
  fVar58 = auVar94._8_4_;
  fStack_150 = fVar58 + fStack_150;
  fVar227 = auVar94._12_4_;
  fStack_14c = fVar227 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar16 = vsubps_avx(ZEXT1632(auVar94),auVar31);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar16);
  auVar32._4_4_ = fVar88 * fVar272;
  auVar32._0_4_ = fVar60 * fVar271;
  auVar32._8_4_ = fVar122 * fVar193;
  auVar32._12_4_ = fVar86 * fVar194;
  auVar32._16_4_ = fVar195 * 0.0;
  auVar32._20_4_ = fVar196 * 0.0;
  auVar32._24_4_ = fVar197 * 0.0;
  auVar32._28_4_ = auVar16._28_4_;
  auVar212 = vfnmadd231ps_fma(auVar32,local_b8,auVar83);
  fStack_15c = fStack_3cc + 0.0;
  auVar33._4_4_ = fStack_174 * fVar272;
  auVar33._0_4_ = local_178 * fVar271;
  auVar33._8_4_ = fStack_170 * fVar193;
  auVar33._12_4_ = fStack_16c * fVar194;
  auVar33._16_4_ = fStack_168 * fVar195;
  auVar33._20_4_ = fStack_164 * fVar196;
  auVar33._24_4_ = fStack_160 * fVar197;
  auVar33._28_4_ = 0;
  auVar129 = vfnmadd231ps_fma(auVar33,auVar83,auVar109);
  auVar34._4_4_ = local_198._4_4_ * fVar272;
  auVar34._0_4_ = local_198._0_4_ * fVar271;
  auVar34._8_4_ = local_198._8_4_ * fVar193;
  auVar34._12_4_ = local_198._12_4_ * fVar194;
  auVar34._16_4_ = local_198._16_4_ * fVar195;
  auVar34._20_4_ = local_198._20_4_ * fVar196;
  auVar34._24_4_ = local_198._24_4_ * fVar197;
  auVar34._28_4_ = fStack_3cc + 0.0;
  auVar65 = vfnmadd231ps_fma(auVar34,local_d8,auVar83);
  local_618._0_4_ = auVar19._0_4_;
  local_618._4_4_ = auVar19._4_4_;
  uStack_610._0_4_ = auVar19._8_4_;
  uStack_610._4_4_ = auVar19._12_4_;
  uStack_608._0_4_ = auVar19._16_4_;
  uStack_608._4_4_ = auVar19._20_4_;
  uStack_600._0_4_ = auVar19._24_4_;
  uStack_600._4_4_ = auVar19._28_4_;
  auVar35._4_4_ = (float)local_618._4_4_ * fVar272;
  auVar35._0_4_ = (float)local_618._0_4_ * fVar271;
  auVar35._8_4_ = (float)uStack_610 * fVar193;
  auVar35._12_4_ = uStack_610._4_4_ * fVar194;
  auVar35._16_4_ = (float)uStack_608 * fVar195;
  auVar35._20_4_ = uStack_608._4_4_ * fVar196;
  auVar35._24_4_ = (float)uStack_600 * fVar197;
  auVar35._28_4_ = uStack_600._4_4_;
  auVar67 = vfnmadd231ps_fma(auVar35,local_4e8,auVar83);
  auVar208._0_4_ = fVar87 * fVar271;
  auVar208._4_4_ = fVar59 * fVar272;
  auVar208._8_4_ = fVar58 * fVar193;
  auVar208._12_4_ = fVar227 * fVar194;
  auVar208._16_4_ = fVar195 * 0.0;
  auVar208._20_4_ = fVar196 * 0.0;
  auVar208._24_4_ = fVar197 * 0.0;
  auVar208._28_4_ = 0;
  auVar251 = vfnmadd231ps_fma(auVar208,auVar258,auVar83);
  uStack_13c = 0x40400000;
  auVar36._4_4_ = fStack_154 * fVar272;
  auVar36._0_4_ = local_158 * fVar271;
  auVar36._8_4_ = fStack_150 * fVar193;
  auVar36._12_4_ = fStack_14c * fVar194;
  auVar36._16_4_ = fStack_148 * fVar195;
  auVar36._20_4_ = fStack_144 * fVar196;
  auVar36._24_4_ = fStack_140 * fVar197;
  auVar36._28_4_ = local_4e8._28_4_;
  auVar95 = vfnmadd231ps_fma(auVar36,local_118,auVar83);
  auVar37._4_4_ = local_138._4_4_ * fVar272;
  auVar37._0_4_ = local_138._0_4_ * fVar271;
  auVar37._8_4_ = local_138._8_4_ * fVar193;
  auVar37._12_4_ = local_138._12_4_ * fVar194;
  auVar37._16_4_ = local_138._16_4_ * fVar195;
  auVar37._20_4_ = local_138._20_4_ * fVar196;
  auVar37._24_4_ = local_138._24_4_ * fVar197;
  auVar37._28_4_ = local_138._28_4_;
  auVar244 = vfnmadd231ps_fma(auVar37,auVar21,auVar83);
  auVar38._4_4_ = auVar20._4_4_ * fVar272;
  auVar38._0_4_ = auVar20._0_4_ * fVar271;
  auVar38._8_4_ = auVar20._8_4_ * fVar193;
  auVar38._12_4_ = auVar20._12_4_ * fVar194;
  auVar38._16_4_ = auVar20._16_4_ * fVar195;
  auVar38._20_4_ = auVar20._20_4_ * fVar196;
  auVar38._24_4_ = auVar20._24_4_ * fVar197;
  auVar38._28_4_ = auVar82._28_4_ + auVar17._28_4_;
  auVar225 = ZEXT3264(_local_508);
  auVar113 = vfnmadd231ps_fma(auVar38,_local_508,auVar83);
  auVar16 = vminps_avx(ZEXT1632(auVar212),ZEXT1632(auVar129));
  auVar82 = vmaxps_avx(ZEXT1632(auVar212),ZEXT1632(auVar129));
  auVar17 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar67));
  auVar17 = vminps_avx(auVar16,auVar17);
  auVar16 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar67));
  auVar82 = vmaxps_avx(auVar82,auVar16);
  auVar18 = vminps_avx(ZEXT1632(auVar251),ZEXT1632(auVar95));
  auVar16 = vmaxps_avx(ZEXT1632(auVar251),ZEXT1632(auVar95));
  auVar11 = vminps_avx(ZEXT1632(auVar244),ZEXT1632(auVar113));
  auVar18 = vminps_avx(auVar18,auVar11);
  auVar18 = vminps_avx(auVar17,auVar18);
  auVar17 = vmaxps_avx(ZEXT1632(auVar244),ZEXT1632(auVar113));
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar16 = vmaxps_avx(auVar82,auVar16);
  auVar47._4_4_ = fStack_74;
  auVar47._0_4_ = local_78;
  auVar47._8_4_ = fStack_70;
  auVar47._12_4_ = fStack_6c;
  auVar47._16_4_ = fStack_68;
  auVar47._20_4_ = fStack_64;
  auVar47._24_4_ = fStack_60;
  auVar47._28_4_ = fStack_5c;
  auVar82 = vcmpps_avx(auVar18,auVar47,2);
  auVar46._4_4_ = fStack_94;
  auVar46._0_4_ = local_98;
  auVar46._8_4_ = fStack_90;
  auVar46._12_4_ = fStack_8c;
  auVar46._16_4_ = fStack_88;
  auVar46._20_4_ = fStack_84;
  auVar46._24_4_ = fStack_80;
  auVar46._28_4_ = fStack_7c;
  auVar16 = vcmpps_avx(auVar16,auVar46,5);
  auVar82 = vandps_avx(auVar16,auVar82);
  auVar16 = local_1b8 & auVar82;
  if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0x7f,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar16 >> 0xbf,0) != '\0') ||
      (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0') {
    auVar16 = vsubps_avx(local_4e8,local_b8);
    auVar17 = vsubps_avx(_local_508,auVar258);
    fVar272 = auVar16._0_4_ + auVar17._0_4_;
    fVar193 = auVar16._4_4_ + auVar17._4_4_;
    fVar194 = auVar16._8_4_ + auVar17._8_4_;
    fVar195 = auVar16._12_4_ + auVar17._12_4_;
    fVar196 = auVar16._16_4_ + auVar17._16_4_;
    fVar197 = auVar16._20_4_ + auVar17._20_4_;
    fVar89 = auVar16._24_4_ + auVar17._24_4_;
    auVar18 = vsubps_avx(auVar19,local_f8);
    auVar11 = vsubps_avx(auVar20,ZEXT1632(auVar94));
    auVar110._0_4_ = auVar18._0_4_ + auVar11._0_4_;
    auVar110._4_4_ = auVar18._4_4_ + auVar11._4_4_;
    auVar110._8_4_ = auVar18._8_4_ + auVar11._8_4_;
    auVar110._12_4_ = auVar18._12_4_ + auVar11._12_4_;
    auVar110._16_4_ = auVar18._16_4_ + auVar11._16_4_;
    auVar110._20_4_ = auVar18._20_4_ + auVar11._20_4_;
    auVar110._24_4_ = auVar18._24_4_ + auVar11._24_4_;
    fVar271 = auVar11._28_4_;
    auVar110._28_4_ = auVar18._28_4_ + fVar271;
    auVar39._4_4_ = fVar88 * fVar193;
    auVar39._0_4_ = fVar60 * fVar272;
    auVar39._8_4_ = fVar122 * fVar194;
    auVar39._12_4_ = fVar86 * fVar195;
    auVar39._16_4_ = fVar196 * 0.0;
    auVar39._20_4_ = fVar197 * 0.0;
    auVar39._24_4_ = fVar89 * 0.0;
    auVar39._28_4_ = auVar20._28_4_;
    auVar251 = vfnmadd231ps_fma(auVar39,auVar110,local_b8);
    auVar40._4_4_ = fVar193 * fStack_174;
    auVar40._0_4_ = fVar272 * local_178;
    auVar40._8_4_ = fVar194 * fStack_170;
    auVar40._12_4_ = fVar195 * fStack_16c;
    auVar40._16_4_ = fVar196 * fStack_168;
    auVar40._20_4_ = fVar197 * fStack_164;
    auVar40._24_4_ = fVar89 * fStack_160;
    auVar40._28_4_ = 0;
    auVar212 = vfnmadd213ps_fma(auVar109,auVar110,auVar40);
    auVar41._4_4_ = fVar193 * local_198._4_4_;
    auVar41._0_4_ = fVar272 * local_198._0_4_;
    auVar41._8_4_ = fVar194 * local_198._8_4_;
    auVar41._12_4_ = fVar195 * local_198._12_4_;
    auVar41._16_4_ = fVar196 * local_198._16_4_;
    auVar41._20_4_ = fVar197 * local_198._20_4_;
    auVar41._24_4_ = fVar89 * local_198._24_4_;
    auVar41._28_4_ = 0;
    auVar129 = vfnmadd213ps_fma(local_d8,auVar110,auVar41);
    auVar42._4_4_ = (float)local_618._4_4_ * fVar193;
    auVar42._0_4_ = (float)local_618._0_4_ * fVar272;
    auVar42._8_4_ = (float)uStack_610 * fVar194;
    auVar42._12_4_ = uStack_610._4_4_ * fVar195;
    auVar42._16_4_ = (float)uStack_608 * fVar196;
    auVar42._20_4_ = uStack_608._4_4_ * fVar197;
    auVar42._24_4_ = (float)uStack_600 * fVar89;
    auVar42._28_4_ = 0;
    auVar94 = vfnmadd231ps_fma(auVar42,auVar110,local_4e8);
    auVar132._0_4_ = fVar87 * fVar272;
    auVar132._4_4_ = fVar59 * fVar193;
    auVar132._8_4_ = fVar58 * fVar194;
    auVar132._12_4_ = fVar227 * fVar195;
    auVar132._16_4_ = fVar196 * 0.0;
    auVar132._20_4_ = fVar197 * 0.0;
    auVar132._24_4_ = fVar89 * 0.0;
    auVar132._28_4_ = 0;
    auVar95 = vfnmadd231ps_fma(auVar132,auVar110,auVar258);
    auVar43._4_4_ = fVar193 * fStack_154;
    auVar43._0_4_ = fVar272 * local_158;
    auVar43._8_4_ = fVar194 * fStack_150;
    auVar43._12_4_ = fVar195 * fStack_14c;
    auVar43._16_4_ = fVar196 * fStack_148;
    auVar43._20_4_ = fVar197 * fStack_144;
    auVar43._24_4_ = fVar89 * fStack_140;
    auVar43._28_4_ = fVar271;
    auVar65 = vfnmadd213ps_fma(local_118,auVar110,auVar43);
    auVar44._4_4_ = fVar193 * local_138._4_4_;
    auVar44._0_4_ = fVar272 * local_138._0_4_;
    auVar44._8_4_ = fVar194 * local_138._8_4_;
    auVar44._12_4_ = fVar195 * local_138._12_4_;
    auVar44._16_4_ = fVar196 * local_138._16_4_;
    auVar44._20_4_ = fVar197 * local_138._20_4_;
    auVar44._24_4_ = fVar89 * local_138._24_4_;
    auVar44._28_4_ = fVar271;
    auVar67 = vfnmadd213ps_fma(auVar21,auVar110,auVar44);
    auVar225 = ZEXT1664(auVar67);
    auVar45._4_4_ = fVar193 * auVar20._4_4_;
    auVar45._0_4_ = fVar272 * auVar20._0_4_;
    auVar45._8_4_ = fVar194 * auVar20._8_4_;
    auVar45._12_4_ = fVar195 * auVar20._12_4_;
    auVar45._16_4_ = fVar196 * auVar20._16_4_;
    auVar45._20_4_ = fVar197 * auVar20._20_4_;
    auVar45._24_4_ = fVar89 * auVar20._24_4_;
    auVar45._28_4_ = auVar16._28_4_ + auVar17._28_4_;
    auVar244 = vfnmadd231ps_fma(auVar45,auVar110,_local_508);
    auVar17 = vminps_avx(ZEXT1632(auVar251),ZEXT1632(auVar212));
    auVar16 = vmaxps_avx(ZEXT1632(auVar251),ZEXT1632(auVar212));
    auVar18 = vminps_avx(ZEXT1632(auVar129),ZEXT1632(auVar94));
    auVar18 = vminps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(ZEXT1632(auVar129),ZEXT1632(auVar94));
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar11 = vminps_avx(ZEXT1632(auVar95),ZEXT1632(auVar65));
    auVar17 = vmaxps_avx(ZEXT1632(auVar95),ZEXT1632(auVar65));
    auVar19 = vminps_avx(ZEXT1632(auVar67),ZEXT1632(auVar244));
    auVar11 = vminps_avx(auVar11,auVar19);
    auVar11 = vminps_avx(auVar18,auVar11);
    auVar18 = vmaxps_avx(ZEXT1632(auVar67),ZEXT1632(auVar244));
    auVar17 = vmaxps_avx(auVar17,auVar18);
    auVar17 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vcmpps_avx(auVar11,auVar47,2);
    auVar17 = vcmpps_avx(auVar17,auVar46,5);
    auVar16 = vandps_avx(auVar17,auVar16);
    auVar82 = vandps_avx(auVar82,local_1b8);
    auVar17 = auVar82 & auVar16;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar82 = vandps_avx(auVar16,auVar82);
      uVar52 = vmovmskps_avx(auVar82);
      if (uVar52 != 0) {
        mask_stack[uVar56] = uVar52 & 0xff;
        BVar2 = (BBox1f)vmovlps_avx(auVar106);
        cu_stack[uVar56] = BVar2;
        BVar2 = (BBox1f)vmovlps_avx(auVar68);
        cv_stack[uVar56] = BVar2;
        uVar56 = (ulong)((int)uVar56 + 1);
      }
    }
  }
LAB_01132527:
  if ((int)uVar56 == 0) {
    uVar53 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar81._4_4_ = uVar53;
    auVar81._0_4_ = uVar53;
    auVar81._8_4_ = uVar53;
    auVar81._12_4_ = uVar53;
    auVar106 = vcmpps_avx(auVar200,auVar81,2);
    uVar49 = vmovmskps_avx(auVar106);
    uVar54 = (ulong)((uint)uVar54 & uVar49);
    goto LAB_01131780;
  }
  uVar48 = (int)uVar56 - 1;
  uVar52 = mask_stack[uVar48];
  fVar60 = cu_stack[uVar48].lower;
  fVar88 = cu_stack[uVar48].upper;
  iVar22 = 0;
  for (uVar55 = (ulong)uVar52; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    iVar22 = iVar22 + 1;
  }
  uVar52 = uVar52 - 1 & uVar52;
  if (uVar52 == 0) {
    uVar56 = (ulong)uVar48;
  }
  auVar68._8_8_ = 0;
  auVar68._0_4_ = cv_stack[uVar48].lower;
  auVar68._4_4_ = cv_stack[uVar48].upper;
  mask_stack[uVar48] = uVar52;
  fVar122 = (float)(iVar22 + 1) * 0.14285715;
  auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * (float)iVar22 * 0.14285715)),
                             ZEXT416((uint)fVar60),ZEXT416((uint)(1.0 - (float)iVar22 * 0.14285715))
                            );
  auVar212 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * fVar122)),ZEXT416((uint)fVar60),
                             ZEXT416((uint)(1.0 - fVar122)));
  fVar88 = auVar212._0_4_;
  auVar192._0_4_ = auVar106._0_4_;
  fVar60 = fVar88 - auVar192._0_4_;
  if (fVar60 < 0.16666667) {
    auVar129 = vshufps_avx(auVar68,auVar68,0x50);
    auVar96._8_4_ = 0x3f800000;
    auVar96._0_8_ = 0x3f8000003f800000;
    auVar96._12_4_ = 0x3f800000;
    auVar65 = vsubps_avx(auVar96,auVar129);
    fVar122 = auVar129._0_4_;
    auVar138._0_4_ = fVar122 * fVar134;
    fVar86 = auVar129._4_4_;
    auVar138._4_4_ = fVar86 * fVar144;
    fVar87 = auVar129._8_4_;
    auVar138._8_4_ = fVar87 * fVar134;
    fVar59 = auVar129._12_4_;
    auVar138._12_4_ = fVar59 * fVar144;
    auVar149._0_4_ = fVar122 * fVar259;
    auVar149._4_4_ = fVar86 * fVar270;
    auVar149._8_4_ = fVar87 * fVar259;
    auVar149._12_4_ = fVar59 * fVar270;
    auVar174._0_4_ = fVar122 * fVar198;
    auVar174._4_4_ = fVar86 * fVar209;
    auVar174._8_4_ = fVar87 * fVar198;
    auVar174._12_4_ = fVar59 * fVar209;
    auVar70._0_4_ = fVar122 * fVar210;
    auVar70._4_4_ = fVar86 * fVar226;
    auVar70._8_4_ = fVar87 * fVar210;
    auVar70._12_4_ = fVar59 * fVar226;
    auVar129 = vfmadd231ps_fma(auVar138,auVar65,auVar185);
    auVar67 = vfmadd231ps_fma(auVar149,auVar65,auVar231);
    auVar251 = vfmadd231ps_fma(auVar174,auVar65,auVar250);
    auVar65 = vfmadd231ps_fma(auVar70,auVar65,auVar261);
    auVar133._16_16_ = auVar129;
    auVar133._0_16_ = auVar129;
    auVar143._16_16_ = auVar67;
    auVar143._0_16_ = auVar67;
    auVar157._16_16_ = auVar251;
    auVar157._0_16_ = auVar251;
    auVar192._4_4_ = auVar192._0_4_;
    auVar192._8_4_ = auVar192._0_4_;
    auVar192._12_4_ = auVar192._0_4_;
    auVar192._20_4_ = fVar88;
    auVar192._16_4_ = fVar88;
    auVar192._24_4_ = fVar88;
    auVar192._28_4_ = fVar88;
    auVar82 = vsubps_avx(auVar143,auVar133);
    auVar67 = vfmadd213ps_fma(auVar82,auVar192,auVar133);
    auVar82 = vsubps_avx(auVar157,auVar143);
    auVar94 = vfmadd213ps_fma(auVar82,auVar192,auVar143);
    auVar129 = vsubps_avx(auVar65,auVar251);
    auVar84._16_16_ = auVar129;
    auVar84._0_16_ = auVar129;
    auVar129 = vfmadd213ps_fma(auVar84,auVar192,auVar157);
    auVar82 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar67));
    auVar65 = vfmadd213ps_fma(auVar82,auVar192,ZEXT1632(auVar67));
    auVar82 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar94));
    auVar129 = vfmadd213ps_fma(auVar82,auVar192,ZEXT1632(auVar94));
    auVar82 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar65));
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar82,auVar192);
    fVar227 = auVar82._4_4_ * 3.0;
    local_4e8._0_4_ = fVar60;
    fVar122 = fVar60 * 0.33333334;
    auVar97._0_8_ =
         CONCAT44(auVar113._4_4_ + fVar122 * fVar227,auVar113._0_4_ + fVar122 * auVar82._0_4_ * 3.0)
    ;
    auVar97._8_4_ = auVar113._8_4_ + fVar122 * auVar82._8_4_ * 3.0;
    auVar97._12_4_ = auVar113._12_4_ + fVar122 * auVar82._12_4_ * 3.0;
    auVar65 = vshufpd_avx(auVar113,auVar113,3);
    auVar67 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    _local_508 = auVar65;
    auVar129 = vsubps_avx(auVar65,auVar113);
    auVar251 = vsubps_avx(auVar67,(undefined1  [16])0x0);
    auVar71._0_4_ = auVar129._0_4_ + auVar251._0_4_;
    auVar71._4_4_ = auVar129._4_4_ + auVar251._4_4_;
    auVar71._8_4_ = auVar129._8_4_ + auVar251._8_4_;
    auVar71._12_4_ = auVar129._12_4_ + auVar251._12_4_;
    auVar129 = vshufps_avx(auVar113,auVar113,0xb1);
    auVar251 = vshufps_avx(auVar97,auVar97,0xb1);
    auVar276._4_4_ = auVar71._0_4_;
    auVar276._0_4_ = auVar71._0_4_;
    auVar276._8_4_ = auVar71._0_4_;
    auVar276._12_4_ = auVar71._0_4_;
    auVar94 = vshufps_avx(auVar71,auVar71,0x55);
    fVar86 = auVar94._0_4_;
    auVar72._0_4_ = fVar86 * auVar129._0_4_;
    fVar87 = auVar94._4_4_;
    auVar72._4_4_ = fVar87 * auVar129._4_4_;
    fVar59 = auVar94._8_4_;
    auVar72._8_4_ = fVar59 * auVar129._8_4_;
    fVar58 = auVar94._12_4_;
    auVar72._12_4_ = fVar58 * auVar129._12_4_;
    auVar150._0_4_ = fVar86 * auVar251._0_4_;
    auVar150._4_4_ = fVar87 * auVar251._4_4_;
    auVar150._8_4_ = fVar59 * auVar251._8_4_;
    auVar150._12_4_ = fVar58 * auVar251._12_4_;
    auVar95 = vfmadd231ps_fma(auVar72,auVar276,auVar113);
    auVar244 = vfmadd231ps_fma(auVar150,auVar276,auVar97);
    auVar251 = vshufps_avx(auVar95,auVar95,0xe8);
    auVar94 = vshufps_avx(auVar244,auVar244,0xe8);
    auVar129 = vcmpps_avx(auVar251,auVar94,1);
    uVar52 = vextractps_avx(auVar129,0);
    auVar114 = auVar244;
    if ((uVar52 & 1) == 0) {
      auVar114 = auVar95;
    }
    auVar125._0_4_ = fVar122 * auVar82._16_4_ * 3.0;
    auVar125._4_4_ = fVar122 * fVar227;
    auVar125._8_4_ = fVar122 * auVar82._24_4_ * 3.0;
    auVar125._12_4_ = fVar122 * auVar225._28_4_;
    auVar147 = vsubps_avx((undefined1  [16])0x0,auVar125);
    auVar126 = vshufps_avx(auVar147,auVar147,0xb1);
    auVar136 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar186._0_4_ = fVar86 * auVar126._0_4_;
    auVar186._4_4_ = fVar87 * auVar126._4_4_;
    auVar186._8_4_ = fVar59 * auVar126._8_4_;
    auVar186._12_4_ = fVar58 * auVar126._12_4_;
    auVar204._0_4_ = auVar136._0_4_ * fVar86;
    auVar204._4_4_ = auVar136._4_4_ * fVar87;
    auVar204._8_4_ = auVar136._8_4_ * fVar59;
    auVar204._12_4_ = auVar136._12_4_ * fVar58;
    auVar148 = vfmadd231ps_fma(auVar186,auVar276,auVar147);
    auVar162 = vfmadd231ps_fma(auVar204,(undefined1  [16])0x0,auVar276);
    auVar136 = vshufps_avx(auVar148,auVar148,0xe8);
    auVar146 = vshufps_avx(auVar162,auVar162,0xe8);
    auVar225 = ZEXT1664(auVar146);
    auVar126 = vcmpps_avx(auVar136,auVar146,1);
    uVar52 = vextractps_avx(auVar126,0);
    auVar163 = auVar162;
    if ((uVar52 & 1) == 0) {
      auVar163 = auVar148;
    }
    auVar114 = vmaxss_avx(auVar163,auVar114);
    auVar251 = vminps_avx(auVar251,auVar94);
    auVar94 = vminps_avx(auVar136,auVar146);
    auVar94 = vminps_avx(auVar251,auVar94);
    auVar129 = vshufps_avx(auVar129,auVar129,0x55);
    auVar129 = vblendps_avx(auVar129,auVar126,2);
    auVar126 = vpslld_avx(auVar129,0x1f);
    auVar129 = vshufpd_avx(auVar244,auVar244,1);
    auVar129 = vinsertps_avx(auVar129,auVar162,0x9c);
    auVar251 = vshufpd_avx(auVar95,auVar95,1);
    auVar251 = vinsertps_avx(auVar251,auVar148,0x9c);
    auVar129 = vblendvps_avx(auVar251,auVar129,auVar126);
    auVar251 = vmovshdup_avx(auVar129);
    auVar129 = vmaxss_avx(auVar251,auVar129);
    fVar59 = auVar94._0_4_;
    auVar251 = vmovshdup_avx(auVar94);
    fVar87 = auVar129._0_4_;
    fVar122 = auVar251._0_4_;
    fVar86 = auVar114._0_4_;
    if (((0.0001 <= fVar59) || (fVar87 <= -0.0001)) && (0.0001 <= fVar122 || fVar87 <= -0.0001))
    goto code_r0x01132834;
    goto LAB_0113285a;
  }
  auVar106 = vinsertps_avx(auVar106,auVar212,0x10);
  goto LAB_01131f77;
code_r0x01132834:
  auVar251 = vcmpps_avx(auVar251,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar95 = vcmpps_avx(auVar94,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar251 = vandps_avx(auVar95,auVar251);
  if (fVar86 <= -0.0001 || (auVar251 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01132527;
LAB_0113285a:
  auVar95 = vcmpps_avx(auVar94,_DAT_01f45a50,1);
  auVar244 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar251 = vcmpss_avx(auVar114,ZEXT816(0) << 0x20,1);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar116._8_4_ = 0xbf800000;
  auVar116._0_8_ = 0xbf800000bf800000;
  auVar116._12_4_ = 0xbf800000;
  auVar251 = vblendvps_avx(auVar98,auVar116,auVar251);
  auVar95 = vblendvps_avx(auVar98,auVar116,auVar95);
  fVar227 = auVar95._0_4_;
  fVar58 = auVar251._0_4_;
  auVar251 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar227 == fVar58) && (!NAN(fVar227) && !NAN(fVar58))) {
    auVar251 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar227 == fVar58) && (!NAN(fVar227) && !NAN(fVar58))) {
    auVar244 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar95 = vmovshdup_avx(auVar95);
  fVar271 = auVar95._0_4_;
  if ((fVar227 != fVar271) || (NAN(fVar227) || NAN(fVar271))) {
    if ((fVar122 != fVar59) || (NAN(fVar122) || NAN(fVar59))) {
      auVar127._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
      auVar127._8_4_ = auVar94._8_4_ ^ 0x80000000;
      auVar127._12_4_ = auVar94._12_4_ ^ 0x80000000;
      auVar128._0_4_ = -fVar59 / (fVar122 - fVar59);
      auVar128._4_12_ = auVar127._4_12_;
      auVar94 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar128._0_4_)),auVar128,ZEXT416(0));
      auVar95 = auVar94;
    }
    else {
      auVar94 = ZEXT816(0) << 0x20;
      if ((fVar59 != 0.0) || (auVar95 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar59))) {
        auVar94 = SUB6416(ZEXT464(0x7f800000),0);
        auVar95 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar251 = vminss_avx(auVar251,auVar94);
    auVar244 = vmaxss_avx(auVar95,auVar244);
  }
  auVar129 = vcmpss_avx(auVar129,ZEXT416(0),1);
  auVar99._8_4_ = 0x3f800000;
  auVar99._0_8_ = 0x3f8000003f800000;
  auVar99._12_4_ = 0x3f800000;
  auVar117._8_4_ = 0xbf800000;
  auVar117._0_8_ = 0xbf800000bf800000;
  auVar117._12_4_ = 0xbf800000;
  auVar129 = vblendvps_avx(auVar99,auVar117,auVar129);
  fVar122 = auVar129._0_4_;
  if ((fVar58 != fVar122) || (NAN(fVar58) || NAN(fVar122))) {
    if ((fVar87 != fVar86) || (NAN(fVar87) || NAN(fVar86))) {
      auVar73._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
      auVar73._8_4_ = auVar114._8_4_ ^ 0x80000000;
      auVar73._12_4_ = auVar114._12_4_ ^ 0x80000000;
      auVar130._0_4_ = -fVar86 / (fVar87 - fVar86);
      auVar130._4_12_ = auVar73._4_12_;
      auVar129 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar130,ZEXT416(0));
      auVar94 = auVar129;
    }
    else {
      auVar129 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar86 != 0.0) || (auVar94 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar86))) {
        auVar129 = SUB6416(ZEXT464(0xff800000),0);
        auVar94 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar251 = vminss_avx(auVar251,auVar94);
    auVar244 = vmaxss_avx(auVar129,auVar244);
  }
  if ((fVar271 != fVar122) || (NAN(fVar271) || NAN(fVar122))) {
    auVar251 = vminss_avx(auVar251,SUB6416(ZEXT464(0x3f800000),0));
    auVar244 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar244);
  }
  auVar129 = vmaxss_avx(ZEXT816(0) << 0x40,auVar251);
  auVar251 = vminss_avx(auVar244,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar251._0_4_ < auVar129._0_4_) goto LAB_01132527;
  auVar129 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar129._0_4_ + -0.1)));
  auVar251 = vminss_avx(ZEXT416((uint)(auVar251._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar139._0_8_ = auVar113._0_8_;
  auVar139._8_8_ = auVar139._0_8_;
  auVar217._8_8_ = auVar97._0_8_;
  auVar217._0_8_ = auVar97._0_8_;
  auVar232._8_8_ = auVar147._0_8_;
  auVar232._0_8_ = auVar147._0_8_;
  auVar94 = vshufpd_avx(auVar97,auVar97,3);
  auVar95 = vshufpd_avx(auVar147,auVar147,3);
  auVar244 = vshufps_avx(auVar129,auVar251,0);
  auVar74._8_4_ = 0x3f800000;
  auVar74._0_8_ = 0x3f8000003f800000;
  auVar74._12_4_ = 0x3f800000;
  auVar113 = vsubps_avx(auVar74,auVar244);
  local_508._0_4_ = auVar65._0_4_;
  local_508._4_4_ = auVar65._4_4_;
  fStack_500 = auVar65._8_4_;
  fStack_4fc = auVar65._12_4_;
  fVar122 = auVar244._0_4_;
  auVar75._0_4_ = fVar122 * (float)local_508._0_4_;
  fVar86 = auVar244._4_4_;
  auVar75._4_4_ = fVar86 * (float)local_508._4_4_;
  fVar87 = auVar244._8_4_;
  auVar75._8_4_ = fVar87 * fStack_500;
  fVar59 = auVar244._12_4_;
  auVar75._12_4_ = fVar59 * fStack_4fc;
  auVar175._0_4_ = fVar122 * auVar94._0_4_;
  auVar175._4_4_ = fVar86 * auVar94._4_4_;
  auVar175._8_4_ = fVar87 * auVar94._8_4_;
  auVar175._12_4_ = fVar59 * auVar94._12_4_;
  auVar187._0_4_ = fVar122 * auVar95._0_4_;
  auVar187._4_4_ = fVar86 * auVar95._4_4_;
  auVar187._8_4_ = fVar87 * auVar95._8_4_;
  auVar187._12_4_ = fVar59 * auVar95._12_4_;
  auVar205._0_4_ = fVar122 * auVar67._0_4_;
  auVar205._4_4_ = fVar86 * auVar67._4_4_;
  auVar205._8_4_ = fVar87 * auVar67._8_4_;
  auVar205._12_4_ = fVar59 * auVar67._12_4_;
  auVar94 = vfmadd231ps_fma(auVar75,auVar113,auVar139);
  auVar95 = vfmadd231ps_fma(auVar175,auVar113,auVar217);
  auVar244 = vfmadd231ps_fma(auVar187,auVar113,auVar232);
  auVar113 = vfmadd231ps_fma(auVar205,auVar113,ZEXT816(0));
  auVar65 = vmovshdup_avx(auVar68);
  auVar146 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar129._0_4_)),auVar68,
                             ZEXT416((uint)(1.0 - auVar129._0_4_)));
  auVar147 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar251._0_4_)),auVar68,
                             ZEXT416((uint)(1.0 - auVar251._0_4_)));
  fVar122 = 1.0 / fVar60;
  auVar68 = vsubps_avx(auVar95,auVar94);
  auVar218._0_4_ = auVar68._0_4_ * 3.0;
  auVar218._4_4_ = auVar68._4_4_ * 3.0;
  auVar218._8_4_ = auVar68._8_4_ * 3.0;
  auVar218._12_4_ = auVar68._12_4_ * 3.0;
  auVar68 = vsubps_avx(auVar244,auVar95);
  auVar233._0_4_ = auVar68._0_4_ * 3.0;
  auVar233._4_4_ = auVar68._4_4_ * 3.0;
  auVar233._8_4_ = auVar68._8_4_ * 3.0;
  auVar233._12_4_ = auVar68._12_4_ * 3.0;
  auVar68 = vsubps_avx(auVar113,auVar244);
  auVar245._0_4_ = auVar68._0_4_ * 3.0;
  auVar245._4_4_ = auVar68._4_4_ * 3.0;
  auVar245._8_4_ = auVar68._8_4_ * 3.0;
  auVar245._12_4_ = auVar68._12_4_ * 3.0;
  auVar129 = vminps_avx(auVar233,auVar245);
  auVar68 = vmaxps_avx(auVar233,auVar245);
  auVar129 = vminps_avx(auVar218,auVar129);
  auVar68 = vmaxps_avx(auVar218,auVar68);
  auVar65 = vshufpd_avx(auVar129,auVar129,3);
  auVar67 = vshufpd_avx(auVar68,auVar68,3);
  auVar129 = vminps_avx(auVar129,auVar65);
  auVar68 = vmaxps_avx(auVar68,auVar67);
  auVar234._0_4_ = auVar129._0_4_ * fVar122;
  auVar234._4_4_ = auVar129._4_4_ * fVar122;
  auVar234._8_4_ = auVar129._8_4_ * fVar122;
  auVar234._12_4_ = auVar129._12_4_ * fVar122;
  auVar219._0_4_ = auVar68._0_4_ * fVar122;
  auVar219._4_4_ = auVar68._4_4_ * fVar122;
  auVar219._8_4_ = auVar68._8_4_ * fVar122;
  auVar219._12_4_ = auVar68._12_4_ * fVar122;
  fVar122 = 1.0 / (auVar147._0_4_ - auVar146._0_4_);
  auVar68 = vshufpd_avx(auVar94,auVar94,3);
  auVar129 = vshufpd_avx(auVar95,auVar95,3);
  auVar65 = vshufpd_avx(auVar244,auVar244,3);
  auVar67 = vshufpd_avx(auVar113,auVar113,3);
  auVar68 = vsubps_avx(auVar68,auVar94);
  auVar251 = vsubps_avx(auVar129,auVar95);
  auVar94 = vsubps_avx(auVar65,auVar244);
  auVar67 = vsubps_avx(auVar67,auVar113);
  auVar129 = vminps_avx(auVar68,auVar251);
  auVar68 = vmaxps_avx(auVar68,auVar251);
  auVar65 = vminps_avx(auVar94,auVar67);
  auVar65 = vminps_avx(auVar129,auVar65);
  auVar129 = vmaxps_avx(auVar94,auVar67);
  auVar68 = vmaxps_avx(auVar68,auVar129);
  auVar262._0_4_ = fVar122 * auVar65._0_4_;
  auVar262._4_4_ = fVar122 * auVar65._4_4_;
  auVar262._8_4_ = fVar122 * auVar65._8_4_;
  auVar262._12_4_ = fVar122 * auVar65._12_4_;
  auVar252._0_4_ = fVar122 * auVar68._0_4_;
  auVar252._4_4_ = fVar122 * auVar68._4_4_;
  auVar252._8_4_ = fVar122 * auVar68._8_4_;
  auVar252._12_4_ = fVar122 * auVar68._12_4_;
  auVar67 = vinsertps_avx(auVar106,auVar146,0x10);
  auVar251 = vinsertps_avx(auVar212,auVar147,0x10);
  auVar246._0_4_ = (auVar67._0_4_ + auVar251._0_4_) * 0.5;
  auVar246._4_4_ = (auVar67._4_4_ + auVar251._4_4_) * 0.5;
  auVar246._8_4_ = (auVar67._8_4_ + auVar251._8_4_) * 0.5;
  auVar246._12_4_ = (auVar67._12_4_ + auVar251._12_4_) * 0.5;
  auVar76._4_4_ = auVar246._0_4_;
  auVar76._0_4_ = auVar246._0_4_;
  auVar76._8_4_ = auVar246._0_4_;
  auVar76._12_4_ = auVar246._0_4_;
  auVar68 = vfmadd213ps_fma(auVar10,auVar76,auVar13);
  auVar129 = vfmadd213ps_fma(auVar12,auVar76,auVar14);
  auVar65 = vfmadd213ps_fma(auVar161,auVar76,auVar15);
  auVar212 = vsubps_avx(auVar129,auVar68);
  auVar68 = vfmadd213ps_fma(auVar212,auVar76,auVar68);
  auVar212 = vsubps_avx(auVar65,auVar129);
  auVar212 = vfmadd213ps_fma(auVar212,auVar76,auVar129);
  auVar212 = vsubps_avx(auVar212,auVar68);
  auVar68 = vfmadd231ps_fma(auVar68,auVar212,auVar76);
  auVar77._0_8_ = CONCAT44(auVar212._4_4_ * 3.0,auVar212._0_4_ * 3.0);
  auVar77._8_4_ = auVar212._8_4_ * 3.0;
  auVar77._12_4_ = auVar212._12_4_ * 3.0;
  auVar277._8_8_ = auVar68._0_8_;
  auVar277._0_8_ = auVar68._0_8_;
  auVar212 = vshufpd_avx(auVar68,auVar68,3);
  auVar68 = vshufps_avx(auVar246,auVar246,0x55);
  auVar95 = vsubps_avx(auVar212,auVar277);
  auVar113 = vfmadd231ps_fma(auVar277,auVar68,auVar95);
  auVar283._8_8_ = auVar77._0_8_;
  auVar283._0_8_ = auVar77._0_8_;
  auVar212 = vshufpd_avx(auVar77,auVar77,3);
  auVar212 = vsubps_avx(auVar212,auVar283);
  auVar244 = vfmadd213ps_fma(auVar212,auVar68,auVar283);
  auVar68 = vmovshdup_avx(auVar244);
  auVar284._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
  auVar284._8_4_ = auVar68._8_4_ ^ 0x80000000;
  auVar284._12_4_ = auVar68._12_4_ ^ 0x80000000;
  auVar129 = vmovshdup_avx(auVar95);
  auVar212 = vunpcklps_avx(auVar129,auVar284);
  auVar65 = vshufps_avx(auVar212,auVar284,4);
  auVar94 = vshufps_avx(auVar246,auVar246,0x54);
  auVar131._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
  auVar131._8_4_ = auVar95._8_4_ ^ 0x80000000;
  auVar131._12_4_ = auVar95._12_4_ ^ 0x80000000;
  auVar212 = vmovlhps_avx(auVar131,auVar244);
  auVar212 = vshufps_avx(auVar212,auVar244,8);
  auVar68 = vfmsub231ss_fma(ZEXT416((uint)(auVar95._0_4_ * auVar68._0_4_)),auVar129,auVar244);
  uVar53 = auVar68._0_4_;
  auVar78._4_4_ = uVar53;
  auVar78._0_4_ = uVar53;
  auVar78._8_4_ = uVar53;
  auVar78._12_4_ = uVar53;
  auVar68 = vdivps_avx(auVar65,auVar78);
  auVar129 = vdivps_avx(auVar212,auVar78);
  fVar87 = auVar113._0_4_;
  fVar122 = auVar68._0_4_;
  auVar212 = vshufps_avx(auVar113,auVar113,0x55);
  fVar86 = auVar129._0_4_;
  auVar79._0_4_ = fVar87 * fVar122 + auVar212._0_4_ * fVar86;
  auVar79._4_4_ = fVar87 * auVar68._4_4_ + auVar212._4_4_ * auVar129._4_4_;
  auVar79._8_4_ = fVar87 * auVar68._8_4_ + auVar212._8_4_ * auVar129._8_4_;
  auVar79._12_4_ = fVar87 * auVar68._12_4_ + auVar212._12_4_ * auVar129._12_4_;
  auVar136 = vsubps_avx(auVar94,auVar79);
  auVar94 = vmovshdup_avx(auVar68);
  auVar212 = vinsertps_avx(auVar234,auVar262,0x1c);
  auVar151._0_4_ = auVar94._0_4_ * auVar212._0_4_;
  auVar151._4_4_ = auVar94._4_4_ * auVar212._4_4_;
  auVar151._8_4_ = auVar94._8_4_ * auVar212._8_4_;
  auVar151._12_4_ = auVar94._12_4_ * auVar212._12_4_;
  auVar65 = vinsertps_avx(auVar219,auVar252,0x1c);
  auVar100._0_4_ = auVar65._0_4_ * auVar94._0_4_;
  auVar100._4_4_ = auVar65._4_4_ * auVar94._4_4_;
  auVar100._8_4_ = auVar65._8_4_ * auVar94._8_4_;
  auVar100._12_4_ = auVar65._12_4_ * auVar94._12_4_;
  auVar113 = vminps_avx(auVar151,auVar100);
  auVar244 = vmaxps_avx(auVar100,auVar151);
  auVar94 = vinsertps_avx(auVar262,auVar234,0x4c);
  auVar114 = vmovshdup_avx(auVar129);
  auVar95 = vinsertps_avx(auVar252,auVar219,0x4c);
  auVar253._0_4_ = auVar114._0_4_ * auVar94._0_4_;
  auVar253._4_4_ = auVar114._4_4_ * auVar94._4_4_;
  auVar253._8_4_ = auVar114._8_4_ * auVar94._8_4_;
  auVar253._12_4_ = auVar114._12_4_ * auVar94._12_4_;
  auVar235._0_4_ = auVar114._0_4_ * auVar95._0_4_;
  auVar235._4_4_ = auVar114._4_4_ * auVar95._4_4_;
  auVar235._8_4_ = auVar114._8_4_ * auVar95._8_4_;
  auVar235._12_4_ = auVar114._12_4_ * auVar95._12_4_;
  auVar114 = vminps_avx(auVar253,auVar235);
  auVar263._0_4_ = auVar113._0_4_ + auVar114._0_4_;
  auVar263._4_4_ = auVar113._4_4_ + auVar114._4_4_;
  auVar263._8_4_ = auVar113._8_4_ + auVar114._8_4_;
  auVar263._12_4_ = auVar113._12_4_ + auVar114._12_4_;
  auVar113 = vmaxps_avx(auVar235,auVar253);
  auVar101._0_4_ = auVar113._0_4_ + auVar244._0_4_;
  auVar101._4_4_ = auVar113._4_4_ + auVar244._4_4_;
  auVar101._8_4_ = auVar113._8_4_ + auVar244._8_4_;
  auVar101._12_4_ = auVar113._12_4_ + auVar244._12_4_;
  auVar236._8_8_ = 0x3f80000000000000;
  auVar236._0_8_ = 0x3f80000000000000;
  auVar244 = vsubps_avx(auVar236,auVar101);
  auVar113 = vsubps_avx(auVar236,auVar263);
  auVar114 = vsubps_avx(auVar67,auVar246);
  auVar126 = vsubps_avx(auVar251,auVar246);
  auVar118._0_4_ = fVar122 * auVar212._0_4_;
  auVar118._4_4_ = fVar122 * auVar212._4_4_;
  auVar118._8_4_ = fVar122 * auVar212._8_4_;
  auVar118._12_4_ = fVar122 * auVar212._12_4_;
  auVar264._0_4_ = fVar122 * auVar65._0_4_;
  auVar264._4_4_ = fVar122 * auVar65._4_4_;
  auVar264._8_4_ = fVar122 * auVar65._8_4_;
  auVar264._12_4_ = fVar122 * auVar65._12_4_;
  auVar65 = vminps_avx(auVar118,auVar264);
  auVar212 = vmaxps_avx(auVar264,auVar118);
  auVar152._0_4_ = fVar86 * auVar94._0_4_;
  auVar152._4_4_ = fVar86 * auVar94._4_4_;
  auVar152._8_4_ = fVar86 * auVar94._8_4_;
  auVar152._12_4_ = fVar86 * auVar94._12_4_;
  auVar220._0_4_ = fVar86 * auVar95._0_4_;
  auVar220._4_4_ = fVar86 * auVar95._4_4_;
  auVar220._8_4_ = fVar86 * auVar95._8_4_;
  auVar220._12_4_ = fVar86 * auVar95._12_4_;
  auVar94 = vminps_avx(auVar152,auVar220);
  auVar265._0_4_ = auVar65._0_4_ + auVar94._0_4_;
  auVar265._4_4_ = auVar65._4_4_ + auVar94._4_4_;
  auVar265._8_4_ = auVar65._8_4_ + auVar94._8_4_;
  auVar265._12_4_ = auVar65._12_4_ + auVar94._12_4_;
  fVar271 = auVar114._0_4_;
  auVar278._0_4_ = fVar271 * auVar244._0_4_;
  fVar272 = auVar114._4_4_;
  auVar278._4_4_ = fVar272 * auVar244._4_4_;
  fVar193 = auVar114._8_4_;
  auVar278._8_4_ = fVar193 * auVar244._8_4_;
  fVar194 = auVar114._12_4_;
  auVar278._12_4_ = fVar194 * auVar244._12_4_;
  auVar65 = vmaxps_avx(auVar220,auVar152);
  auVar221._0_4_ = fVar271 * auVar113._0_4_;
  auVar221._4_4_ = fVar272 * auVar113._4_4_;
  auVar221._8_4_ = fVar193 * auVar113._8_4_;
  auVar221._12_4_ = fVar194 * auVar113._12_4_;
  fVar87 = auVar126._0_4_;
  auVar102._0_4_ = fVar87 * auVar244._0_4_;
  fVar59 = auVar126._4_4_;
  auVar102._4_4_ = fVar59 * auVar244._4_4_;
  fVar58 = auVar126._8_4_;
  auVar102._8_4_ = fVar58 * auVar244._8_4_;
  fVar227 = auVar126._12_4_;
  auVar102._12_4_ = fVar227 * auVar244._12_4_;
  auVar237._0_4_ = fVar87 * auVar113._0_4_;
  auVar237._4_4_ = fVar59 * auVar113._4_4_;
  auVar237._8_4_ = fVar58 * auVar113._8_4_;
  auVar237._12_4_ = fVar227 * auVar113._12_4_;
  auVar119._0_4_ = auVar212._0_4_ + auVar65._0_4_;
  auVar119._4_4_ = auVar212._4_4_ + auVar65._4_4_;
  auVar119._8_4_ = auVar212._8_4_ + auVar65._8_4_;
  auVar119._12_4_ = auVar212._12_4_ + auVar65._12_4_;
  auVar153._8_8_ = 0x3f800000;
  auVar153._0_8_ = 0x3f800000;
  auVar212 = vsubps_avx(auVar153,auVar119);
  auVar65 = vsubps_avx(auVar153,auVar265);
  auVar266._0_4_ = fVar271 * auVar212._0_4_;
  auVar266._4_4_ = fVar272 * auVar212._4_4_;
  auVar266._8_4_ = fVar193 * auVar212._8_4_;
  auVar266._12_4_ = fVar194 * auVar212._12_4_;
  auVar254._0_4_ = fVar271 * auVar65._0_4_;
  auVar254._4_4_ = fVar272 * auVar65._4_4_;
  auVar254._8_4_ = fVar193 * auVar65._8_4_;
  auVar254._12_4_ = fVar194 * auVar65._12_4_;
  auVar120._0_4_ = fVar87 * auVar212._0_4_;
  auVar120._4_4_ = fVar59 * auVar212._4_4_;
  auVar120._8_4_ = fVar58 * auVar212._8_4_;
  auVar120._12_4_ = fVar227 * auVar212._12_4_;
  auVar154._0_4_ = fVar87 * auVar65._0_4_;
  auVar154._4_4_ = fVar59 * auVar65._4_4_;
  auVar154._8_4_ = fVar58 * auVar65._8_4_;
  auVar154._12_4_ = fVar227 * auVar65._12_4_;
  auVar212 = vminps_avx(auVar266,auVar254);
  auVar65 = vminps_avx(auVar120,auVar154);
  auVar212 = vminps_avx(auVar212,auVar65);
  auVar65 = vmaxps_avx(auVar254,auVar266);
  auVar94 = vmaxps_avx(auVar154,auVar120);
  auVar95 = vminps_avx(auVar278,auVar221);
  auVar244 = vminps_avx(auVar102,auVar237);
  auVar95 = vminps_avx(auVar95,auVar244);
  auVar212 = vhaddps_avx(auVar212,auVar95);
  auVar65 = vmaxps_avx(auVar94,auVar65);
  auVar94 = vmaxps_avx(auVar221,auVar278);
  auVar95 = vmaxps_avx(auVar237,auVar102);
  auVar94 = vmaxps_avx(auVar95,auVar94);
  auVar65 = vhaddps_avx(auVar65,auVar94);
  auVar212 = vshufps_avx(auVar212,auVar212,0xe8);
  auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
  auVar238._0_4_ = auVar136._0_4_ + auVar212._0_4_;
  auVar238._4_4_ = auVar136._4_4_ + auVar212._4_4_;
  auVar238._8_4_ = auVar136._8_4_ + auVar212._8_4_;
  auVar238._12_4_ = auVar136._12_4_ + auVar212._12_4_;
  auVar222._0_4_ = auVar136._0_4_ + auVar65._0_4_;
  auVar222._4_4_ = auVar136._4_4_ + auVar65._4_4_;
  auVar222._8_4_ = auVar136._8_4_ + auVar65._8_4_;
  auVar222._12_4_ = auVar136._12_4_ + auVar65._12_4_;
  auVar225 = ZEXT1664(auVar222);
  auVar212 = vmaxps_avx(auVar67,auVar238);
  auVar65 = vminps_avx(auVar222,auVar251);
  auVar212 = vcmpps_avx(auVar65,auVar212,1);
  auVar212 = vshufps_avx(auVar212,auVar212,0x50);
  if ((auVar212 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar212[0xf] < '\0')
  goto LAB_01132527;
  bVar51 = 0;
  if ((auVar192._0_4_ < auVar238._0_4_) && (bVar51 = 0, auVar222._0_4_ < auVar251._0_4_)) {
    auVar65 = vmovshdup_avx(auVar238);
    auVar212 = vcmpps_avx(auVar222,auVar251,1);
    bVar51 = auVar212[4] & auVar146._0_4_ < auVar65._0_4_;
  }
  p03.field_0.i[0] = auVar64._0_4_;
  p03.field_0.i[1] = auVar64._4_4_;
  p03.field_0.i[2] = auVar64._8_4_;
  p03.field_0.i[3] = auVar64._12_4_;
  if (((3 < (uint)uVar56 || fVar60 < 0.001) | bVar51) == 1) {
    lVar50 = 0xc9;
    auVar225 = ZEXT464(0x40400000);
    do {
      lVar50 = lVar50 + -1;
      if (lVar50 == 0) goto LAB_01132527;
      fVar59 = auVar136._0_4_;
      fVar87 = 1.0 - fVar59;
      fVar60 = fVar87 * fVar87 * fVar87;
      fVar88 = fVar59 * 3.0 * fVar87 * fVar87;
      fVar87 = fVar87 * fVar59 * fVar59 * 3.0;
      auVar140._4_4_ = fVar60;
      auVar140._0_4_ = fVar60;
      auVar140._8_4_ = fVar60;
      auVar140._12_4_ = fVar60;
      auVar121._4_4_ = fVar88;
      auVar121._0_4_ = fVar88;
      auVar121._8_4_ = fVar88;
      auVar121._12_4_ = fVar88;
      auVar103._4_4_ = fVar87;
      auVar103._0_4_ = fVar87;
      auVar103._8_4_ = fVar87;
      auVar103._12_4_ = fVar87;
      fVar59 = fVar59 * fVar59 * fVar59;
      auVar155._0_4_ = p03.field_0.v[0] * fVar59;
      auVar155._4_4_ = p03.field_0.v[1] * fVar59;
      auVar155._8_4_ = p03.field_0.v[2] * fVar59;
      auVar155._12_4_ = p03.field_0.v[3] * fVar59;
      auVar106 = vfmadd231ps_fma(auVar155,auVar15,auVar103);
      auVar106 = vfmadd231ps_fma(auVar106,auVar14,auVar121);
      auVar106 = vfmadd231ps_fma(auVar106,auVar13,auVar140);
      auVar104._8_8_ = auVar106._0_8_;
      auVar104._0_8_ = auVar106._0_8_;
      auVar106 = vshufpd_avx(auVar106,auVar106,3);
      auVar212 = vshufps_avx(auVar136,auVar136,0x55);
      auVar106 = vsubps_avx(auVar106,auVar104);
      auVar212 = vfmadd213ps_fma(auVar106,auVar212,auVar104);
      fVar60 = auVar212._0_4_;
      auVar106 = vshufps_avx(auVar212,auVar212,0x55);
      auVar105._0_4_ = fVar122 * fVar60 + fVar86 * auVar106._0_4_;
      auVar105._4_4_ = auVar68._4_4_ * fVar60 + auVar129._4_4_ * auVar106._4_4_;
      auVar105._8_4_ = auVar68._8_4_ * fVar60 + auVar129._8_4_ * auVar106._8_4_;
      auVar105._12_4_ = auVar68._12_4_ * fVar60 + auVar129._12_4_ * auVar106._12_4_;
      auVar136 = vsubps_avx(auVar136,auVar105);
      auVar106 = vandps_avx(auVar242,auVar212);
      auVar212 = vshufps_avx(auVar106,auVar106,0xf5);
      auVar106 = vmaxss_avx(auVar212,auVar106);
    } while (fVar85 <= auVar106._0_4_);
    fVar60 = auVar136._0_4_;
    if ((0.0 <= fVar60) && (fVar60 <= 1.0)) {
      auVar106 = vmovshdup_avx(auVar136);
      fVar88 = auVar106._0_4_;
      if ((0.0 <= fVar88) && (fVar88 <= 1.0)) {
        auVar106 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                 ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar94 = vinsertps_avx(auVar106,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar106 = vdpps_avx(auVar94,auVar62,0x7f);
        auVar212 = vdpps_avx(auVar94,auVar93,0x7f);
        auVar68 = vdpps_avx(auVar94,auVar123,0x7f);
        auVar129 = vdpps_avx(auVar94,auVar135,0x7f);
        auVar65 = vdpps_avx(auVar94,auVar61,0x7f);
        auVar67 = vdpps_avx(auVar94,auVar91,0x7f);
        auVar251 = vdpps_avx(auVar94,auVar159,0x7f);
        auVar94 = vdpps_avx(auVar94,auVar160,0x7f);
        fVar122 = 1.0 - fVar88;
        auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * auVar65._0_4_)),ZEXT416((uint)fVar122),
                                   auVar106);
        auVar212 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * fVar88)),ZEXT416((uint)fVar122),
                                   auVar212);
        auVar68 = vfmadd231ss_fma(ZEXT416((uint)(auVar251._0_4_ * fVar88)),ZEXT416((uint)fVar122),
                                  auVar68);
        auVar225 = ZEXT1664(auVar68);
        auVar129 = vfmadd231ss_fma(ZEXT416((uint)(fVar88 * auVar94._0_4_)),ZEXT416((uint)fVar122),
                                   auVar129);
        fVar59 = 1.0 - fVar60;
        fVar122 = fVar59 * fVar60 * fVar60 * 3.0;
        fVar227 = fVar60 * fVar60 * fVar60;
        auVar68 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * auVar129._0_4_)),ZEXT416((uint)fVar122),
                                  auVar68);
        fVar86 = fVar60 * 3.0 * fVar59 * fVar59;
        auVar212 = vfmadd231ss_fma(auVar68,ZEXT416((uint)fVar86),auVar212);
        fVar87 = fVar59 * fVar59 * fVar59;
        auVar106 = vfmadd231ss_fma(auVar212,ZEXT416((uint)fVar87),auVar106);
        fVar58 = auVar106._0_4_;
        if (((fVar57 <= fVar58) && (fVar271 = *(float *)(ray + k * 4 + 0x80), fVar58 <= fVar271)) &&
           (pGVar6 = (context->scene->geometries).items[uVar49].ptr,
           (pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
          auVar106 = vshufps_avx(auVar136,auVar136,0x55);
          auVar223._8_4_ = 0x3f800000;
          auVar223._0_8_ = 0x3f8000003f800000;
          auVar223._12_4_ = 0x3f800000;
          auVar212 = vsubps_avx(auVar223,auVar106);
          fVar272 = auVar106._0_4_;
          auVar239._0_4_ = fVar272 * auVar230._0_4_;
          fVar193 = auVar106._4_4_;
          auVar239._4_4_ = fVar193 * auVar230._4_4_;
          fVar194 = auVar106._8_4_;
          auVar239._8_4_ = fVar194 * auVar230._8_4_;
          fVar195 = auVar106._12_4_;
          auVar239._12_4_ = fVar195 * auVar230._12_4_;
          auVar247._0_4_ = fVar272 * auVar66._0_4_;
          auVar247._4_4_ = fVar193 * auVar66._4_4_;
          auVar247._8_4_ = fVar194 * auVar66._8_4_;
          auVar247._12_4_ = fVar195 * auVar66._12_4_;
          local_498 = auVar145._0_4_;
          fStack_494 = auVar145._4_4_;
          fStack_490 = auVar145._8_4_;
          fStack_48c = auVar145._12_4_;
          auVar255._0_4_ = fVar272 * local_498;
          auVar255._4_4_ = fVar193 * fStack_494;
          auVar255._8_4_ = fVar194 * fStack_490;
          auVar255._12_4_ = fVar195 * fStack_48c;
          auVar267._0_4_ = fVar272 * fVar158;
          auVar267._4_4_ = fVar193 * fVar178;
          auVar267._8_4_ = fVar194 * fVar179;
          auVar267._12_4_ = fVar195 * fVar180;
          auVar68 = vfmadd231ps_fma(auVar239,auVar212,auVar63);
          auVar129 = vfmadd231ps_fma(auVar247,auVar212,auVar124);
          auVar65 = vfmadd231ps_fma(auVar255,auVar212,auVar112);
          auVar67 = vfmadd231ps_fma(auVar267,auVar212,auVar92);
          auVar212 = vsubps_avx(auVar129,auVar68);
          auVar68 = vsubps_avx(auVar65,auVar129);
          auVar129 = vsubps_avx(auVar67,auVar65);
          local_218._4_4_ = fVar60;
          local_218._0_4_ = fVar60;
          local_218._8_4_ = fVar60;
          local_218._12_4_ = fVar60;
          auVar225 = ZEXT1664(local_218);
          auVar268._0_4_ = fVar60 * auVar68._0_4_;
          auVar268._4_4_ = fVar60 * auVar68._4_4_;
          auVar268._8_4_ = fVar60 * auVar68._8_4_;
          auVar268._12_4_ = fVar60 * auVar68._12_4_;
          auVar206._4_4_ = fVar59;
          auVar206._0_4_ = fVar59;
          auVar206._8_4_ = fVar59;
          auVar206._12_4_ = fVar59;
          auVar212 = vfmadd231ps_fma(auVar268,auVar206,auVar212);
          auVar240._0_4_ = fVar60 * auVar129._0_4_;
          auVar240._4_4_ = fVar60 * auVar129._4_4_;
          auVar240._8_4_ = fVar60 * auVar129._8_4_;
          auVar240._12_4_ = fVar60 * auVar129._12_4_;
          auVar68 = vfmadd231ps_fma(auVar240,auVar206,auVar68);
          auVar241._0_4_ = fVar60 * auVar68._0_4_;
          auVar241._4_4_ = fVar60 * auVar68._4_4_;
          auVar241._8_4_ = fVar60 * auVar68._8_4_;
          auVar241._12_4_ = fVar60 * auVar68._12_4_;
          auVar68 = vfmadd231ps_fma(auVar241,auVar206,auVar212);
          local_368 = auVar211._0_4_;
          fStack_364 = auVar211._4_4_;
          fStack_360 = auVar211._8_4_;
          fStack_35c = auVar211._12_4_;
          auVar188._0_4_ = fVar227 * local_368;
          auVar188._4_4_ = fVar227 * fStack_364;
          auVar188._8_4_ = fVar227 * fStack_360;
          auVar188._12_4_ = fVar227 * fStack_35c;
          auVar141._4_4_ = fVar122;
          auVar141._0_4_ = fVar122;
          auVar141._8_4_ = fVar122;
          auVar141._12_4_ = fVar122;
          auVar212 = vfmadd132ps_fma(auVar141,auVar188,auVar199);
          auVar176._4_4_ = fVar86;
          auVar176._0_4_ = fVar86;
          auVar176._8_4_ = fVar86;
          auVar176._12_4_ = fVar86;
          auVar212 = vfmadd132ps_fma(auVar176,auVar212,auVar182);
          auVar189._0_4_ = auVar68._0_4_ * 3.0;
          auVar189._4_4_ = auVar68._4_4_ * 3.0;
          auVar189._8_4_ = auVar68._8_4_ * 3.0;
          auVar189._12_4_ = auVar68._12_4_ * 3.0;
          auVar156._4_4_ = fVar87;
          auVar156._0_4_ = fVar87;
          auVar156._8_4_ = fVar87;
          auVar156._12_4_ = fVar87;
          auVar68 = vfmadd132ps_fma(auVar156,auVar212,auVar181);
          auVar212 = vshufps_avx(auVar189,auVar189,0xc9);
          auVar142._0_4_ = auVar68._0_4_ * auVar212._0_4_;
          auVar142._4_4_ = auVar68._4_4_ * auVar212._4_4_;
          auVar142._8_4_ = auVar68._8_4_ * auVar212._8_4_;
          auVar142._12_4_ = auVar68._12_4_ * auVar212._12_4_;
          auVar212 = vshufps_avx(auVar68,auVar68,0xc9);
          auVar212 = vfmsub231ps_fma(auVar142,auVar189,auVar212);
          local_228 = auVar212._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x80) = fVar58;
            uVar53 = vextractps_avx(auVar212,1);
            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar53;
            uVar53 = vextractps_avx(auVar212,2);
            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar53;
            *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
            *(float *)(ray + k * 4 + 0xf0) = fVar60;
            *(float *)(ray + k * 4 + 0x100) = fVar88;
            *(uint *)(ray + k * 4 + 0x110) = uVar5;
            *(uint *)(ray + k * 4 + 0x120) = uVar49;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
          else {
            auVar68 = vshufps_avx(auVar212,auVar212,0x55);
            auVar212 = vshufps_avx(auVar212,auVar212,0xaa);
            local_248[0] = (RTCHitN)auVar68[0];
            local_248[1] = (RTCHitN)auVar68[1];
            local_248[2] = (RTCHitN)auVar68[2];
            local_248[3] = (RTCHitN)auVar68[3];
            local_248[4] = (RTCHitN)auVar68[4];
            local_248[5] = (RTCHitN)auVar68[5];
            local_248[6] = (RTCHitN)auVar68[6];
            local_248[7] = (RTCHitN)auVar68[7];
            local_248[8] = (RTCHitN)auVar68[8];
            local_248[9] = (RTCHitN)auVar68[9];
            local_248[10] = (RTCHitN)auVar68[10];
            local_248[0xb] = (RTCHitN)auVar68[0xb];
            local_248[0xc] = (RTCHitN)auVar68[0xc];
            local_248[0xd] = (RTCHitN)auVar68[0xd];
            local_248[0xe] = (RTCHitN)auVar68[0xe];
            local_248[0xf] = (RTCHitN)auVar68[0xf];
            local_238 = auVar212;
            uStack_224 = local_228;
            uStack_220 = local_228;
            uStack_21c = local_228;
            local_208 = auVar106;
            local_1f8 = CONCAT44(uVar5,uVar5);
            uStack_1f0 = CONCAT44(uVar5,uVar5);
            local_1e8._4_4_ = uVar49;
            local_1e8._0_4_ = uVar49;
            local_1e8._8_4_ = uVar49;
            local_1e8._12_4_ = uVar49;
            vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
            uStack_1d4 = context->user->instID[0];
            local_1d8 = uStack_1d4;
            uStack_1d0 = uStack_1d4;
            uStack_1cc = uStack_1d4;
            uStack_1c8 = context->user->instPrimID[0];
            uStack_1c4 = uStack_1c8;
            uStack_1c0 = uStack_1c8;
            uStack_1bc = uStack_1c8;
            *(float *)(ray + k * 4 + 0x80) = fVar58;
            local_528 = *local_510;
            args.valid = (int *)local_528;
            args.geometryUserPtr = pGVar6->userPtr;
            args.context = context->user;
            args.hit = local_248;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              auVar225 = ZEXT1664(local_218);
              (*pGVar6->intersectionFilterN)(&args);
              auVar111._8_56_ = extraout_var;
              auVar111._0_8_ = extraout_XMM1_Qa;
              auVar212 = auVar111._0_16_;
            }
            if (local_528 == (undefined1  [16])0x0) {
              auVar106 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar212 = vpcmpeqd_avx(auVar212,auVar212);
              auVar106 = auVar106 ^ auVar212;
            }
            else {
              p_Var7 = context->args->filter;
              auVar212 = vpcmpeqd_avx(auVar106,auVar106);
              if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                auVar225 = ZEXT1664(auVar225._0_16_);
                (*p_Var7)(&args);
                auVar212 = vpcmpeqd_avx(auVar212,auVar212);
              }
              auVar68 = vpcmpeqd_avx(local_528,_DAT_01f45a50);
              auVar106 = auVar68 ^ auVar212;
              if (local_528 != (undefined1  [16])0x0) {
                auVar68 = auVar68 ^ auVar212;
                auVar212 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])args.hit);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar212;
                auVar212 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(args.hit + 0x10));
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar212;
                auVar212 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(args.hit + 0x20));
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar212;
                auVar212 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(args.hit + 0x30));
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar212;
                auVar212 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(args.hit + 0x40));
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar212;
                auVar212 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar212;
                auVar212 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar212;
                auVar212 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar212;
                auVar212 = vmaskmovps_avx(auVar68,*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar212;
              }
            }
            auVar80._8_8_ = 0x100000001;
            auVar80._0_8_ = 0x100000001;
            if ((auVar80 & auVar106) == (undefined1  [16])0x0) {
              *(float *)(ray + k * 4 + 0x80) = fVar271;
            }
          }
        }
      }
    }
    goto LAB_01132527;
  }
  auVar106 = vinsertps_avx(auVar106,ZEXT416((uint)fVar88),0x10);
  auVar68 = vinsertps_avx(auVar146,ZEXT416((uint)auVar147._0_4_),0x10);
  goto LAB_01131f77;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }